

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImgDisplay * __thiscall
cimg_library::CImgDisplay::set_key(CImgDisplay *this,uint keycode,bool is_pressed)

{
  int iVar1;
  CImgDisplay *pCVar2;
  uint uVar3;
  uint *puVar4;
  
  if ((int)keycode < 0xff1b) {
    if ((int)keycode < 0xff08) {
      switch(keycode) {
      case 0x20:
        goto switchD_0018e41b_caseD_20;
      default:
        goto switchD_0018e3bb_caseD_ffac;
      case 0x30:
        goto switchD_0018e41b_caseD_30;
      case 0x31:
        goto switchD_0018eaa9_caseD_31;
      case 0x32:
        goto switchD_0018eaa9_caseD_32;
      case 0x33:
        goto switchD_0018eaa9_caseD_33;
      case 0x34:
        goto switchD_0018eaa9_caseD_34;
      case 0x35:
        goto switchD_0018eaa9_caseD_35;
      case 0x36:
        goto switchD_0018eaa9_caseD_36;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      case 0x38:
        goto switchD_0018eaa9_caseD_38;
      case 0x39:
        goto switchD_0018e41b_caseD_39;
      case 0x61:
        goto switchD_0018e4a9_caseD_61;
      case 0x62:
        goto switchD_0018e4a9_caseD_62;
      case 99:
        goto switchD_0018e4a9_caseD_63;
      case 100:
        goto switchD_0018e4a9_caseD_64;
      case 0x65:
        goto switchD_0018e4a9_caseD_65;
      case 0x66:
        goto switchD_0018e4a9_caseD_66;
      case 0x67:
        goto switchD_0018e4a9_caseD_67;
      case 0x68:
        goto switchD_0018e4a9_caseD_68;
      case 0x69:
        goto switchD_0018e4a9_caseD_69;
      case 0x6a:
        goto switchD_0018e4a9_caseD_6a;
      case 0x6b:
        goto switchD_0018e4a9_caseD_6b;
      case 0x6c:
        goto switchD_0018e4a9_caseD_6c;
      case 0x6d:
        goto switchD_0018e4a9_caseD_6d;
      case 0x6e:
        goto switchD_0018e4a9_caseD_6e;
      case 0x6f:
        goto switchD_0018e4a9_caseD_6f;
      case 0x70:
        goto switchD_0018e4a9_caseD_70;
      case 0x71:
        goto switchD_0018e4a9_caseD_71;
      case 0x72:
        goto switchD_0018e4a9_caseD_72;
      case 0x73:
        goto switchD_0018e4a9_caseD_73;
      case 0x74:
        goto switchD_0018e4a9_caseD_74;
      case 0x75:
        goto switchD_0018e4a9_caseD_75;
      case 0x76:
        goto switchD_0018e4a9_caseD_76;
      case 0x77:
        goto switchD_0018e4a9_caseD_77;
      case 0x78:
        goto switchD_0018e4a9_caseD_78;
      case 0x79:
        goto switchD_0018e4a9_caseD_79;
      case 0x7a:
        goto switchD_0018e4a9_caseD_7a;
      }
    }
    if ((int)keycode < 0xff0d) {
      if (keycode == 0xff08) goto LAB_0018ee28;
      if (keycode != 0xff09) goto switchD_0018e3bb_caseD_ffac;
      goto LAB_0018e47f;
    }
    if (keycode != 0xff0d) {
      if (keycode != 0xff13) goto switchD_0018e3bb_caseD_ffac;
      goto LAB_0018ea88;
    }
    goto LAB_0018faf4;
  }
  switch(keycode) {
  case 0xffaa:
    goto switchD_0018e3bb_caseD_ffaa;
  case 0xffab:
    goto switchD_0018e3bb_caseD_ffab;
  case 0xffac:
  case 0xffae:
  case 0xffba:
  case 0xffbb:
  case 0xffbc:
  case 0xffbd:
  case 0xffca:
  case 0xffcb:
  case 0xffcc:
  case 0xffcd:
  case 0xffce:
  case 0xffcf:
  case 0xffd0:
  case 0xffd1:
  case 0xffd2:
  case 0xffd3:
  case 0xffd4:
  case 0xffd5:
  case 0xffd6:
  case 0xffd7:
  case 0xffd8:
  case 0xffd9:
  case 0xffda:
  case 0xffdb:
  case 0xffdc:
  case 0xffdd:
  case 0xffde:
  case 0xffdf:
  case 0xffe0:
  case 0xffe6:
  case 0xffe7:
  case 0xffe8:
  case 0xffed:
  case 0xffee:
  case 0xffef:
  case 0xfff0:
  case 0xfff1:
  case 0xfff2:
  case 0xfff3:
  case 0xfff4:
  case 0xfff5:
  case 0xfff6:
  case 0xfff7:
  case 0xfff8:
  case 0xfff9:
  case 0xfffa:
  case 0xfffb:
  case 0xfffc:
  case 0xfffd:
  case 0xfffe:
    goto switchD_0018e3bb_caseD_ffac;
  case 0xffad:
    goto switchD_0018e3bb_caseD_ffad;
  case 0xffaf:
    goto switchD_0018e3bb_caseD_ffaf;
  case 0xffb0:
    goto switchD_0018e3bb_caseD_ffb0;
  case 0xffb1:
    goto switchD_0018e3bb_caseD_ffb1;
  case 0xffb2:
    goto switchD_0018e3bb_caseD_ffb2;
  case 0xffb3:
    goto switchD_0018e3bb_caseD_ffb3;
  case 0xffb4:
    goto switchD_0018e3bb_caseD_ffb4;
  case 0xffb5:
    goto switchD_0018e3bb_caseD_ffb5;
  case 0xffb6:
    goto switchD_0018e3bb_caseD_ffb6;
  case 0xffb7:
    goto switchD_0018e3bb_caseD_ffb7;
  case 0xffb8:
    goto switchD_0018e3bb_caseD_ffb8;
  case 0xffb9:
    goto switchD_0018e3bb_caseD_ffb9;
  case 0xffbe:
    this->_is_keyF1 = is_pressed;
    if (0xff08 < (int)keycode) {
      if ((int)keycode < 0xffbf) {
        if ((int)keycode < 0xff50) {
          if (keycode == 0xff09) goto LAB_0018e47f;
          if (keycode == 0xff13) goto LAB_0018ea88;
        }
        else {
          switch(keycode) {
          case 0xff50:
            goto switchD_0018e45a_caseD_0;
          case 0xff51:
          case 0xff52:
          case 0xff53:
          case 0xff54:
            break;
          case 0xff55:
            goto switchD_0018e45a_caseD_5;
          case 0xff56:
            goto switchD_0018e45a_caseD_6;
          case 0xff57:
            goto switchD_0018e45a_caseD_7;
          default:
            if (keycode == 0xff63) goto switchD_0018e45a_caseD_13;
          }
        }
        goto switchD_0018e8a4_caseD_62;
      }
      switch(keycode) {
      case 0xffbf:
        goto switchD_0018e3bb_caseD_ffbf;
      case 0xffc0:
        goto switchD_0018e3bb_caseD_ffc0;
      case 0xffc1:
        goto switchD_0018e3bb_caseD_ffc1;
      case 0xffc2:
        goto switchD_0018e3bb_caseD_ffc2;
      case 0xffc3:
        goto switchD_0018e3bb_caseD_ffc3;
      case 0xffc4:
        goto switchD_0018e3bb_caseD_ffc4;
      case 0xffc5:
        goto switchD_0018e3bb_caseD_ffc5;
      case 0xffc6:
        goto switchD_0018e3bb_caseD_ffc6;
      case 0xffc7:
        goto switchD_0018e3bb_caseD_ffc7;
      case 0xffc8:
        goto switchD_0018e3bb_caseD_ffc8;
      case 0xffc9:
        goto switchD_0018e3bb_caseD_ffc9;
      }
      goto switchD_0018e558_default;
    }
    switch(keycode) {
    case 0x61:
      goto switchD_0018e4a9_caseD_61;
    case 0x62:
    case 99:
    case 100:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x73:
    case 0x76:
    case 0x78:
      break;
    case 0x65:
      goto switchD_0018e4a9_caseD_65;
    case 0x69:
      goto switchD_0018e4a9_caseD_69;
    case 0x6f:
      goto switchD_0018e4a9_caseD_6f;
    case 0x70:
      goto switchD_0018e4a9_caseD_70;
    case 0x71:
      goto switchD_0018e4a9_caseD_71;
    case 0x72:
      goto switchD_0018e4a9_caseD_72;
    case 0x74:
      goto switchD_0018e4a9_caseD_74;
    case 0x75:
      goto switchD_0018e4a9_caseD_75;
    case 0x77:
      goto switchD_0018e4a9_caseD_77;
    case 0x79:
      goto switchD_0018e4a9_caseD_79;
    default:
      switch(keycode) {
      case 0x30:
        goto switchD_0018e41b_caseD_30;
      case 0x31:
        goto switchD_0018eaa9_caseD_31;
      case 0x32:
        goto switchD_0018eaa9_caseD_32;
      case 0x33:
        goto switchD_0018eaa9_caseD_33;
      case 0x34:
        goto switchD_0018eaa9_caseD_34;
      case 0x35:
        goto switchD_0018eaa9_caseD_35;
      case 0x36:
        goto switchD_0018eaa9_caseD_36;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      case 0x38:
        goto switchD_0018eaa9_caseD_38;
      case 0x39:
        goto switchD_0018e41b_caseD_39;
      default:
        if (keycode == 0xff08) goto LAB_0018ee28;
      }
    }
    goto switchD_0018e8a4_caseD_62;
  case 0xffbf:
switchD_0018e3bb_caseD_ffbf:
    this->_is_keyF2 = is_pressed;
    if ((int)keycode < 0xff08) {
      switch(keycode) {
      case 0x30:
        goto switchD_0018e41b_caseD_30;
      case 0x31:
        goto switchD_0018eaa9_caseD_31;
      case 0x32:
        goto switchD_0018eaa9_caseD_32;
      case 0x33:
        goto switchD_0018eaa9_caseD_33;
      case 0x34:
        goto switchD_0018eaa9_caseD_34;
      case 0x35:
        goto switchD_0018eaa9_caseD_35;
      case 0x36:
        goto switchD_0018eaa9_caseD_36;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      case 0x38:
        goto switchD_0018eaa9_caseD_38;
      case 0x39:
        goto switchD_0018e41b_caseD_39;
      default:
        switch(keycode) {
        case 0x71:
          goto switchD_0018e4a9_caseD_71;
        case 0x72:
          goto switchD_0018e4a9_caseD_72;
        case 0x73:
        case 0x75:
        case 0x76:
        case 0x78:
          break;
        case 0x74:
          goto switchD_0018e4a9_caseD_74;
        case 0x77:
          goto switchD_0018e4a9_caseD_77;
        case 0x79:
          goto switchD_0018e4a9_caseD_79;
        default:
          if (keycode == 0x65) goto switchD_0018e4a9_caseD_65;
        }
      }
    }
    else if ((int)keycode < 0xff55) {
      if ((int)keycode < 0xff13) {
        if (keycode == 0xff08) goto LAB_0018ee28;
        if (keycode == 0xff09) goto LAB_0018e47f;
      }
      else {
        if (keycode == 0xff13) goto LAB_0018ea88;
        if (keycode == 0xff50) goto switchD_0018e45a_caseD_0;
      }
    }
    else {
      switch(keycode) {
      case 0xffc0:
        goto switchD_0018e3bb_caseD_ffc0;
      case 0xffc1:
        goto switchD_0018e3bb_caseD_ffc1;
      case 0xffc2:
        goto switchD_0018e3bb_caseD_ffc2;
      case 0xffc3:
        goto switchD_0018e3bb_caseD_ffc3;
      case 0xffc4:
        goto switchD_0018e3bb_caseD_ffc4;
      case 0xffc5:
        goto switchD_0018e3bb_caseD_ffc5;
      case 0xffc6:
        goto switchD_0018e3bb_caseD_ffc6;
      case 0xffc7:
        goto switchD_0018e3bb_caseD_ffc7;
      case 0xffc8:
        goto switchD_0018e3bb_caseD_ffc8;
      case 0xffc9:
        goto switchD_0018e3bb_caseD_ffc9;
      default:
        if (keycode == 0xff55) goto switchD_0018e45a_caseD_5;
        if (keycode == 0xff63) goto switchD_0018e45a_caseD_13;
      }
    }
    goto switchD_0018e8d3_caseD_73;
  case 0xffc0:
switchD_0018e3bb_caseD_ffc0:
    this->_is_keyF3 = is_pressed;
    if ((int)keycode < 0xff50) {
      if ((int)keycode < 0xff08) {
        switch(keycode) {
        case 0x30:
          goto switchD_0018e41b_caseD_30;
        case 0x31:
          goto switchD_0018eaa9_caseD_31;
        case 0x32:
          goto switchD_0018eaa9_caseD_32;
        case 0x33:
          goto switchD_0018eaa9_caseD_33;
        case 0x34:
          goto switchD_0018eaa9_caseD_34;
        case 0x35:
          goto switchD_0018eaa9_caseD_35;
        case 0x36:
          goto switchD_0018eaa9_caseD_36;
        case 0x37:
          goto switchD_0018eaa9_caseD_37;
        case 0x38:
          goto switchD_0018eaa9_caseD_38;
        case 0x39:
          goto switchD_0018e41b_caseD_39;
        }
      }
      else {
        if (keycode == 0xff08) goto LAB_0018ee28;
        if (keycode == 0xff09) goto LAB_0018e47f;
        if (keycode == 0xff13) goto LAB_0018ea88;
      }
    }
    else if ((int)keycode < 0xffc1) {
      if (keycode == 0xff50) goto switchD_0018e45a_caseD_0;
      if (keycode == 0xff55) goto switchD_0018e45a_caseD_5;
      if (keycode == 0xff63) goto switchD_0018e45a_caseD_13;
    }
    else {
      switch(keycode) {
      case 0xffc1:
        goto switchD_0018e3bb_caseD_ffc1;
      case 0xffc2:
        goto switchD_0018e3bb_caseD_ffc2;
      case 0xffc3:
        goto switchD_0018e3bb_caseD_ffc3;
      case 0xffc4:
        goto switchD_0018e3bb_caseD_ffc4;
      case 0xffc5:
        goto switchD_0018e3bb_caseD_ffc5;
      case 0xffc6:
        goto switchD_0018e3bb_caseD_ffc6;
      case 0xffc7:
        goto switchD_0018e3bb_caseD_ffc7;
      case 0xffc8:
        goto switchD_0018e3bb_caseD_ffc8;
      case 0xffc9:
        goto switchD_0018e3bb_caseD_ffc9;
      }
    }
    goto switchD_0018e611_default;
  case 0xffc1:
switchD_0018e3bb_caseD_ffc1:
    this->_is_keyF4 = is_pressed;
    if (0xff12 < (int)keycode) {
      switch(keycode) {
      case 0xffc2:
        goto switchD_0018e3bb_caseD_ffc2;
      case 0xffc3:
        goto switchD_0018e3bb_caseD_ffc3;
      case 0xffc4:
        goto switchD_0018e3bb_caseD_ffc4;
      case 0xffc5:
        goto switchD_0018e3bb_caseD_ffc5;
      case 0xffc6:
        goto switchD_0018e3bb_caseD_ffc6;
      case 0xffc7:
        goto switchD_0018e3bb_caseD_ffc7;
      case 0xffc8:
        goto switchD_0018e3bb_caseD_ffc8;
      case 0xffc9:
        goto switchD_0018e3bb_caseD_ffc9;
      default:
        if (keycode == 0xff13) goto LAB_0018ea88;
      }
      goto LAB_0018ebc2;
    }
    switch(keycode) {
    case 0x30:
      goto switchD_0018e41b_caseD_30;
    case 0x31:
      goto switchD_0018eaa9_caseD_31;
    case 0x32:
      goto switchD_0018eaa9_caseD_32;
    case 0x33:
      goto switchD_0018eaa9_caseD_33;
    case 0x34:
      goto switchD_0018eaa9_caseD_34;
    case 0x35:
      goto switchD_0018eaa9_caseD_35;
    case 0x36:
      goto switchD_0018eaa9_caseD_36;
    case 0x37:
      goto switchD_0018eaa9_caseD_37;
    case 0x38:
      goto switchD_0018eaa9_caseD_38;
    case 0x39:
      goto switchD_0018e41b_caseD_39;
    default:
      if (keycode == 0xff08) goto LAB_0018ee28;
    }
    goto switchD_0018eb54_caseD_31;
  case 0xffc2:
switchD_0018e3bb_caseD_ffc2:
    this->_is_keyF5 = is_pressed;
    switch(keycode) {
    case 0x30:
      goto switchD_0018e41b_caseD_30;
    case 0x31:
      goto switchD_0018eaa9_caseD_31;
    case 0x32:
      goto switchD_0018eaa9_caseD_32;
    case 0x33:
      goto switchD_0018eaa9_caseD_33;
    case 0x34:
      goto switchD_0018eaa9_caseD_34;
    case 0x35:
      goto switchD_0018eaa9_caseD_35;
    case 0x36:
      goto switchD_0018eaa9_caseD_36;
    case 0x37:
      goto switchD_0018eaa9_caseD_37;
    case 0x38:
      goto switchD_0018eaa9_caseD_38;
    case 0x39:
      goto switchD_0018e41b_caseD_39;
    default:
      switch(keycode) {
      case 0xffc3:
        goto switchD_0018e3bb_caseD_ffc3;
      case 0xffc4:
        goto switchD_0018e3bb_caseD_ffc4;
      case 0xffc5:
        goto switchD_0018e3bb_caseD_ffc5;
      case 0xffc6:
        goto switchD_0018e3bb_caseD_ffc6;
      case 0xffc7:
        goto switchD_0018e3bb_caseD_ffc7;
      case 0xffc8:
        goto switchD_0018e3bb_caseD_ffc8;
      case 0xffc9:
        goto switchD_0018e3bb_caseD_ffc9;
      default:
        if (keycode == 0xff13) goto LAB_0018ea88;
      }
    }
    goto switchD_0018eb12_caseD_31;
  case 0xffc3:
switchD_0018e3bb_caseD_ffc3:
    this->_is_keyF6 = is_pressed;
    switch(keycode) {
    case 0x31:
      goto switchD_0018eaa9_caseD_31;
    case 0x32:
      goto switchD_0018eaa9_caseD_32;
    case 0x33:
      goto switchD_0018eaa9_caseD_33;
    case 0x34:
      goto switchD_0018eaa9_caseD_34;
    case 0x35:
      goto switchD_0018eaa9_caseD_35;
    case 0x36:
      goto switchD_0018eaa9_caseD_36;
    case 0x37:
      goto switchD_0018eaa9_caseD_37;
    case 0x38:
      goto switchD_0018eaa9_caseD_38;
    case 0x39:
      goto switchD_0018e41b_caseD_39;
    default:
      switch(keycode) {
      case 0xffc4:
        goto switchD_0018e3bb_caseD_ffc4;
      case 0xffc5:
        goto switchD_0018e3bb_caseD_ffc5;
      case 0xffc6:
        goto switchD_0018e3bb_caseD_ffc6;
      case 0xffc7:
        goto switchD_0018e3bb_caseD_ffc7;
      case 0xffc8:
        goto switchD_0018e3bb_caseD_ffc8;
      case 0xffc9:
        goto switchD_0018e3bb_caseD_ffc9;
      default:
        if (keycode == 0xff13) goto LAB_0018ea88;
      }
    }
    goto switchD_0018eacc_default;
  case 0xffc4:
switchD_0018e3bb_caseD_ffc4:
    this->_is_keyF7 = is_pressed;
    switch(keycode) {
    case 0x31:
      goto switchD_0018eaa9_caseD_31;
    case 0x32:
      goto switchD_0018eaa9_caseD_32;
    case 0x33:
      goto switchD_0018eaa9_caseD_33;
    case 0x34:
      goto switchD_0018eaa9_caseD_34;
    case 0x35:
      goto switchD_0018eaa9_caseD_35;
    case 0x36:
      goto switchD_0018eaa9_caseD_36;
    case 0x37:
      goto switchD_0018eaa9_caseD_37;
    case 0x38:
      goto switchD_0018eaa9_caseD_38;
    default:
      switch(keycode) {
      case 0xffc5:
        goto switchD_0018e3bb_caseD_ffc5;
      case 0xffc6:
        goto switchD_0018e3bb_caseD_ffc6;
      case 0xffc7:
        goto switchD_0018e3bb_caseD_ffc7;
      case 0xffc8:
        goto switchD_0018e3bb_caseD_ffc8;
      case 0xffc9:
        goto switchD_0018e3bb_caseD_ffc9;
      }
      goto switchD_0018e882_default;
    }
  case 0xffc5:
switchD_0018e3bb_caseD_ffc5:
    this->_is_keyF8 = is_pressed;
    switch(keycode) {
    case 0x31:
      goto switchD_0018eaa9_caseD_31;
    case 0x32:
      goto switchD_0018eaa9_caseD_32;
    case 0x33:
      goto switchD_0018eaa9_caseD_33;
    case 0x34:
      goto switchD_0018eaa9_caseD_34;
    case 0x35:
      goto switchD_0018eaa9_caseD_35;
    case 0x36:
      goto switchD_0018eaa9_caseD_36;
    case 0x37:
      goto switchD_0018eaa9_caseD_37;
    default:
      switch(keycode) {
      case 0xffc6:
        goto switchD_0018e3bb_caseD_ffc6;
      case 0xffc7:
        goto switchD_0018e3bb_caseD_ffc7;
      case 0xffc8:
        goto switchD_0018e3bb_caseD_ffc8;
      case 0xffc9:
        goto switchD_0018e3bb_caseD_ffc9;
      default:
        if (keycode == 0xff13) goto LAB_0018ea88;
        break;
      }
    }
  case 0xffc6:
switchD_0018e3bb_caseD_ffc6:
    this->_is_keyF9 = is_pressed;
    if ((int)keycode < 0xff13) {
      switch(keycode) {
      case 0x31:
        goto switchD_0018eaa9_caseD_31;
      case 0x32:
        goto switchD_0018eaa9_caseD_32;
      case 0x33:
        goto switchD_0018eaa9_caseD_33;
      case 0x34:
        goto switchD_0018eaa9_caseD_34;
      case 0x35:
        goto switchD_0018eaa9_caseD_35;
      case 0x36:
        goto switchD_0018eaa9_caseD_36;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      }
    }
    else {
      if (0xffc7 < (int)keycode) {
        if (keycode == 0xffc8) goto switchD_0018e3bb_caseD_ffc8;
        goto LAB_0018e858;
      }
      if (keycode == 0xff13) goto LAB_0018ea88;
      if (keycode == 0xffc7) goto switchD_0018e3bb_caseD_ffc7;
    }
    break;
  case 0xffc7:
switchD_0018e3bb_caseD_ffc7:
    this->_is_keyF10 = is_pressed;
    if ((int)keycode < 0xff13) {
      switch(keycode) {
      case 0x31:
        goto switchD_0018eaa9_caseD_31;
      case 0x32:
        goto switchD_0018eaa9_caseD_32;
      case 0x33:
        goto switchD_0018eaa9_caseD_33;
      case 0x34:
        goto switchD_0018eaa9_caseD_34;
      case 0x35:
        goto switchD_0018eaa9_caseD_35;
      case 0x36:
        goto switchD_0018eaa9_caseD_36;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      }
    }
    else {
      if (keycode == 0xff13) goto LAB_0018ea88;
      if (keycode == 0xffc9) goto switchD_0018e3bb_caseD_ffc9;
      if (keycode == 0xffc8) goto switchD_0018e3bb_caseD_ffc8;
    }
    break;
  case 0xffc8:
switchD_0018e3bb_caseD_ffc8:
    this->_is_keyF11 = is_pressed;
    switch(keycode) {
    case 0x31:
      goto switchD_0018eaa9_caseD_31;
    case 0x32:
      goto switchD_0018eaa9_caseD_32;
    case 0x33:
      goto switchD_0018eaa9_caseD_33;
    case 0x34:
      goto switchD_0018eaa9_caseD_34;
    case 0x35:
      goto switchD_0018eaa9_caseD_35;
    case 0x36:
      goto switchD_0018eaa9_caseD_36;
    case 0x37:
      goto switchD_0018eaa9_caseD_37;
    default:
      if (keycode != 0xff13) {
LAB_0018e858:
        if (keycode == 0xffc9) goto switchD_0018e3bb_caseD_ffc9;
        break;
      }
      goto LAB_0018ea88;
    }
  case 0xffc9:
switchD_0018e3bb_caseD_ffc9:
    this->_is_keyF12 = is_pressed;
    switch(keycode) {
    case 0x31:
switchD_0018eaa9_caseD_31:
      this->_is_key1 = is_pressed;
      switch(keycode) {
      case 0x32:
        goto switchD_0018eaa9_caseD_32;
      case 0x33:
        goto switchD_0018eaa9_caseD_33;
      case 0x34:
        goto switchD_0018eaa9_caseD_34;
      case 0x35:
        goto switchD_0018eaa9_caseD_35;
      case 0x36:
        goto switchD_0018eaa9_caseD_36;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      case 0x38:
        goto switchD_0018eaa9_caseD_38;
      case 0x39:
        goto switchD_0018e41b_caseD_39;
      default:
        goto switchD_0018eacc_default;
      }
    case 0x32:
switchD_0018eaa9_caseD_32:
      this->_is_key2 = is_pressed;
      switch(keycode) {
      case 0x33:
        goto switchD_0018eaa9_caseD_33;
      case 0x34:
        goto switchD_0018eaa9_caseD_34;
      case 0x35:
        goto switchD_0018eaa9_caseD_35;
      case 0x36:
        goto switchD_0018eaa9_caseD_36;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      case 0x38:
        goto switchD_0018eaa9_caseD_38;
      case 0x39:
        goto switchD_0018e41b_caseD_39;
      }
      goto switchD_0018eacc_default;
    case 0x33:
switchD_0018eaa9_caseD_33:
      this->_is_key3 = is_pressed;
      switch(keycode) {
      case 0x30:
        goto switchD_0018e41b_caseD_30;
      default:
        goto switchD_0018eb12_caseD_31;
      case 0x34:
        goto switchD_0018eaa9_caseD_34;
      case 0x35:
        goto switchD_0018eaa9_caseD_35;
      case 0x36:
        goto switchD_0018eaa9_caseD_36;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      case 0x38:
        goto switchD_0018eaa9_caseD_38;
      case 0x39:
        goto switchD_0018e41b_caseD_39;
      }
    case 0x34:
switchD_0018eaa9_caseD_34:
      this->_is_key4 = is_pressed;
      switch(keycode) {
      case 0x30:
        goto switchD_0018e41b_caseD_30;
      case 0x35:
        goto switchD_0018eaa9_caseD_35;
      case 0x36:
        goto switchD_0018eaa9_caseD_36;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      case 0x38:
        goto switchD_0018eaa9_caseD_38;
      case 0x39:
        goto switchD_0018e41b_caseD_39;
      }
      goto switchD_0018eb12_caseD_31;
    case 0x35:
switchD_0018eaa9_caseD_35:
      this->_is_key5 = is_pressed;
      switch(keycode) {
      case 0x30:
        goto switchD_0018e41b_caseD_30;
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
        goto switchD_0018eb35_caseD_31;
      case 0x36:
        goto switchD_0018eaa9_caseD_36;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      case 0x38:
        goto switchD_0018eaa9_caseD_38;
      case 0x39:
        goto switchD_0018e41b_caseD_39;
      default:
        if (keycode != 0xff08) goto switchD_0018eb35_caseD_31;
        goto LAB_0018ee28;
      }
    case 0x36:
switchD_0018eaa9_caseD_36:
      this->_is_key6 = is_pressed;
      switch(keycode) {
      case 0x30:
        goto switchD_0018e41b_caseD_30;
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
        goto switchD_0018eb54_caseD_31;
      case 0x37:
        goto switchD_0018eaa9_caseD_37;
      case 0x38:
        goto switchD_0018eaa9_caseD_38;
      case 0x39:
        goto switchD_0018e41b_caseD_39;
      default:
        if (keycode == 0xff08) goto LAB_0018ee28;
LAB_0018ebc2:
        if (keycode != 0xff63) goto switchD_0018eb54_caseD_31;
        goto switchD_0018e45a_caseD_13;
      }
    case 0x37:
switchD_0018eaa9_caseD_37:
      this->_is_key7 = is_pressed;
      break;
    case 0x38:
      goto switchD_0018eaa9_caseD_38;
    default:
switchD_0018e882_default:
      if (keycode == 0xff13) {
LAB_0018ea88:
        this->_is_keyPAUSE = is_pressed;
        switch(keycode) {
        case 0x31:
          goto switchD_0018eaa9_caseD_31;
        case 0x32:
          goto switchD_0018eaa9_caseD_32;
        case 0x33:
          goto switchD_0018eaa9_caseD_33;
        case 0x34:
          goto switchD_0018eaa9_caseD_34;
        case 0x35:
          goto switchD_0018eaa9_caseD_35;
        case 0x36:
          goto switchD_0018eaa9_caseD_36;
        case 0x37:
          goto switchD_0018eaa9_caseD_37;
        case 0x38:
          goto switchD_0018eaa9_caseD_38;
        }
      }
      goto switchD_0018eaa9_default;
    }
  case 0xffe1:
    goto switchD_0018e3bb_caseD_ffe1;
  case 0xffe2:
    goto switchD_0018e3bb_caseD_ffe2;
  case 0xffe3:
    goto switchD_0018e3bb_caseD_ffe3;
  case 0xffe4:
    goto switchD_0018e3bb_caseD_ffe4;
  case 0xffe5:
    goto switchD_0018e3bb_caseD_ffe5;
  case 0xffe9:
    goto switchD_0018e3bb_caseD_ffe9;
  case 0xffea:
    goto switchD_0018e3bb_caseD_ffea;
  case 0xffeb:
    goto switchD_0018e3bb_caseD_ffeb;
  case 0xffec:
    goto switchD_0018e3bb_caseD_ffec;
  case 0xffff:
    goto switchD_0018e3bb_caseD_ffff;
  default:
    switch(keycode) {
    case 0xff50:
      goto switchD_0018e45a_caseD_0;
    case 0xff51:
      goto switchD_0018e45a_caseD_1;
    case 0xff52:
      goto switchD_0018e45a_caseD_2;
    case 0xff53:
      goto switchD_0018e45a_caseD_3;
    case 0xff54:
      goto switchD_0018e45a_caseD_4;
    case 0xff55:
      goto switchD_0018e45a_caseD_5;
    case 0xff56:
      goto switchD_0018e45a_caseD_6;
    case 0xff57:
      goto switchD_0018e45a_caseD_7;
    case 0xff58:
    case 0xff59:
    case 0xff5a:
    case 0xff5b:
    case 0xff5c:
    case 0xff5d:
    case 0xff5e:
    case 0xff5f:
    case 0xff60:
    case 0xff61:
    case 0xff62:
    case 0xff64:
    case 0xff65:
    case 0xff66:
      goto switchD_0018e3bb_caseD_ffac;
    case 0xff63:
      goto switchD_0018e45a_caseD_13;
    case 0xff67:
      goto switchD_0018e45a_caseD_17;
    default:
      if (keycode != 0xff1b) goto switchD_0018e3bb_caseD_ffac;
      this->_is_keyESC = is_pressed;
      goto switchD_0018e9e0_caseD_1;
    }
  }
  if (0xff07 < (int)keycode) {
    if ((int)keycode < 0xff50) {
      if (keycode != 0xff08) {
        if (keycode != 0xff09) goto switchD_0018eb86_caseD_66;
LAB_0018e47f:
        this->_is_keyTAB = is_pressed;
switchD_0018e611_default:
        if (0xff0c < (int)keycode) {
          if (0xff66 < (int)keycode) {
            switch(keycode) {
            case 0xffe1:
              goto switchD_0018e3bb_caseD_ffe1;
            case 0xffe2:
              goto switchD_0018e3bb_caseD_ffe2;
            case 0xffe3:
              goto switchD_0018e3bb_caseD_ffe3;
            case 0xffe4:
              goto switchD_0018e3bb_caseD_ffe4;
            case 0xffe5:
              goto switchD_0018e3bb_caseD_ffe5;
            case 0xffe6:
            case 0xffe7:
            case 0xffe8:
              goto switchD_0018e52b_caseD_ffe6;
            case 0xffe9:
              goto switchD_0018e3bb_caseD_ffe9;
            case 0xffea:
              goto switchD_0018e3bb_caseD_ffea;
            case 0xffeb:
              goto switchD_0018e3bb_caseD_ffeb;
            case 0xffec:
              goto switchD_0018e3bb_caseD_ffec;
            default:
              goto switchD_0018e52b_default;
            }
          }
          goto LAB_0018f340;
        }
        switch(keycode) {
        case 0x61:
          goto switchD_0018e4a9_caseD_61;
        case 0x62:
          goto switchD_0018e4a9_caseD_62;
        case 99:
          goto switchD_0018e4a9_caseD_63;
        case 100:
          goto switchD_0018e4a9_caseD_64;
        case 0x65:
          goto switchD_0018e4a9_caseD_65;
        case 0x66:
          goto switchD_0018e4a9_caseD_66;
        case 0x67:
          goto switchD_0018e4a9_caseD_67;
        case 0x68:
          goto switchD_0018e4a9_caseD_68;
        case 0x69:
          goto switchD_0018e4a9_caseD_69;
        case 0x6a:
          goto switchD_0018e4a9_caseD_6a;
        case 0x6b:
          goto switchD_0018e4a9_caseD_6b;
        case 0x6c:
          goto switchD_0018e4a9_caseD_6c;
        case 0x6d:
          goto switchD_0018e4a9_caseD_6d;
        case 0x6e:
          goto switchD_0018e4a9_caseD_6e;
        case 0x6f:
          goto switchD_0018e4a9_caseD_6f;
        case 0x70:
          goto switchD_0018e4a9_caseD_70;
        case 0x71:
          goto switchD_0018e4a9_caseD_71;
        case 0x72:
          goto switchD_0018e4a9_caseD_72;
        case 0x73:
          goto switchD_0018e4a9_caseD_73;
        case 0x74:
          goto switchD_0018e4a9_caseD_74;
        case 0x75:
          goto switchD_0018e4a9_caseD_75;
        case 0x76:
          goto switchD_0018e4a9_caseD_76;
        case 0x77:
          goto switchD_0018e4a9_caseD_77;
        case 0x78:
          goto switchD_0018e4a9_caseD_78;
        case 0x79:
          goto switchD_0018e4a9_caseD_79;
        case 0x7a:
          goto switchD_0018e4a9_caseD_7a;
        }
        goto switchD_0018e4a9_default;
      }
LAB_0018ee28:
      this->_is_keyBACKSPACE = is_pressed;
switchD_0018eb35_caseD_31:
      if (0xff0c < (int)keycode) {
        if (0xffe0 < (int)keycode) {
          switch(keycode) {
          case 0xffe1:
            goto switchD_0018e3bb_caseD_ffe1;
          case 0xffe2:
            goto switchD_0018e3bb_caseD_ffe2;
          case 0xffe3:
            goto switchD_0018e3bb_caseD_ffe3;
          case 0xffe4:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
          case 0xffea:
            goto switchD_0018ee73_caseD_ff51;
          case 0xffe5:
            goto switchD_0018e3bb_caseD_ffe5;
          case 0xffe9:
            goto switchD_0018e3bb_caseD_ffe9;
          case 0xffeb:
            goto switchD_0018e3bb_caseD_ffeb;
          default:
            if (keycode != 0xffff) goto switchD_0018ee73_caseD_ff51;
            goto switchD_0018e3bb_caseD_ffff;
          }
        }
        switch(keycode) {
        case 0xff50:
          goto switchD_0018e45a_caseD_0;
        case 0xff51:
        case 0xff53:
        case 0xff54:
          goto switchD_0018ee73_caseD_ff51;
        case 0xff52:
          goto switchD_0018e45a_caseD_2;
        case 0xff55:
          goto switchD_0018e45a_caseD_5;
        case 0xff56:
          goto switchD_0018e45a_caseD_6;
        case 0xff57:
          goto switchD_0018e45a_caseD_7;
        default:
          if (keycode != 0xff0d) {
            if (keycode == 0xff63) goto switchD_0018e45a_caseD_13;
            goto switchD_0018ee73_caseD_ff51;
          }
          goto LAB_0018faf4;
        }
      }
      switch(keycode) {
      case 0x61:
        goto switchD_0018e4a9_caseD_61;
      case 0x62:
        goto switchD_0018e4a9_caseD_62;
      case 99:
        goto switchD_0018e4a9_caseD_63;
      case 100:
        goto switchD_0018e4a9_caseD_64;
      case 0x65:
        goto switchD_0018e4a9_caseD_65;
      case 0x66:
        goto switchD_0018e4a9_caseD_66;
      case 0x67:
        goto switchD_0018e4a9_caseD_67;
      case 0x68:
        goto switchD_0018e4a9_caseD_68;
      case 0x69:
        goto switchD_0018e4a9_caseD_69;
      case 0x6a:
        goto switchD_0018e4a9_caseD_6a;
      case 0x6b:
        goto switchD_0018e4a9_caseD_6b;
      case 0x6c:
        goto switchD_0018e4a9_caseD_6c;
      case 0x6d:
        goto switchD_0018e4a9_caseD_6d;
      case 0x6e:
        goto switchD_0018e4a9_caseD_6e;
      case 0x6f:
        goto switchD_0018e4a9_caseD_6f;
      case 0x70:
        goto switchD_0018e4a9_caseD_70;
      case 0x71:
        goto switchD_0018e4a9_caseD_71;
      case 0x72:
        goto switchD_0018e4a9_caseD_72;
      case 0x73:
        goto switchD_0018e4a9_caseD_73;
      case 0x74:
        goto switchD_0018e4a9_caseD_74;
      case 0x75:
        goto switchD_0018e4a9_caseD_75;
      case 0x76:
        goto switchD_0018e4a9_caseD_76;
      case 0x77:
        goto switchD_0018e4a9_caseD_77;
      case 0x78:
        goto switchD_0018e4a9_caseD_78;
      case 0x79:
        goto switchD_0018e4a9_caseD_79;
      case 0x7a:
        goto switchD_0018e4a9_caseD_7a;
      default:
        if (keycode != 0x20) {
          if (keycode == 0xff09) goto LAB_0018e47f;
          goto switchD_0018ee73_caseD_ff51;
        }
      }
      goto switchD_0018e41b_caseD_20;
    }
    switch(keycode) {
    case 0xff50:
switchD_0018e45a_caseD_0:
      this->_is_keyHOME = is_pressed;
      if ((int)keycode < 0xff09) {
        switch(keycode) {
        case 0x69:
          goto switchD_0018e4a9_caseD_69;
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x6e:
        case 0x6f:
        case 0x70:
        case 0x73:
        case 0x76:
        case 0x78:
          break;
        case 0x71:
          goto switchD_0018e4a9_caseD_71;
        case 0x72:
          goto switchD_0018e4a9_caseD_72;
        case 0x74:
          goto switchD_0018e4a9_caseD_74;
        case 0x75:
          goto switchD_0018e4a9_caseD_75;
        case 0x77:
          goto switchD_0018e4a9_caseD_77;
        case 0x79:
          goto switchD_0018e4a9_caseD_79;
        default:
          if (keycode == 0x65) goto switchD_0018e4a9_caseD_65;
        }
      }
      else {
        if (keycode == 0xff09) goto LAB_0018e47f;
        if (keycode == 0xff55) goto switchD_0018e45a_caseD_5;
      }
      break;
    case 0xff51:
    case 0xff52:
    case 0xff53:
    case 0xff54:
      goto switchD_0018eb86_caseD_66;
    case 0xff55:
switchD_0018e45a_caseD_5:
      this->_is_keyPAGEUP = is_pressed;
      switch(keycode) {
      case 0x69:
        goto switchD_0018e4a9_caseD_69;
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x6f:
      case 0x70:
      case 0x73:
      case 0x76:
      case 0x78:
        break;
      case 0x71:
        goto switchD_0018e4a9_caseD_71;
      case 0x72:
        goto switchD_0018e4a9_caseD_72;
      case 0x74:
        goto switchD_0018e4a9_caseD_74;
      case 0x75:
        goto switchD_0018e4a9_caseD_75;
      case 0x77:
        goto switchD_0018e4a9_caseD_77;
      case 0x79:
        goto switchD_0018e4a9_caseD_79;
      default:
        if (keycode == 0x65) goto switchD_0018e4a9_caseD_65;
        if (keycode == 0xff09) goto LAB_0018e47f;
      }
      break;
    case 0xff56:
      goto switchD_0018e45a_caseD_6;
    case 0xff57:
      goto switchD_0018e45a_caseD_7;
    default:
      if (keycode != 0xff63) {
LAB_0018f177:
        if (keycode == 0xffff) goto switchD_0018e3bb_caseD_ffff;
        goto switchD_0018eb86_caseD_66;
      }
switchD_0018e45a_caseD_13:
      this->_is_keyINSERT = is_pressed;
switchD_0018eb54_caseD_31:
      if ((int)keycode < 0xff0d) {
        switch(keycode) {
        case 0x61:
          goto switchD_0018e4a9_caseD_61;
        case 0x62:
        case 0x6d:
        case 0x6e:
          break;
        case 99:
          goto switchD_0018e4a9_caseD_63;
        case 100:
          goto switchD_0018e4a9_caseD_64;
        case 0x65:
          goto switchD_0018e4a9_caseD_65;
        case 0x66:
          goto switchD_0018e4a9_caseD_66;
        case 0x67:
          goto switchD_0018e4a9_caseD_67;
        case 0x68:
          goto switchD_0018e4a9_caseD_68;
        case 0x69:
          goto switchD_0018e4a9_caseD_69;
        case 0x6a:
          goto switchD_0018e4a9_caseD_6a;
        case 0x6b:
          goto switchD_0018e4a9_caseD_6b;
        case 0x6c:
          goto switchD_0018e4a9_caseD_6c;
        case 0x6f:
          goto switchD_0018e4a9_caseD_6f;
        case 0x70:
          goto switchD_0018e4a9_caseD_70;
        case 0x71:
          goto switchD_0018e4a9_caseD_71;
        case 0x72:
          goto switchD_0018e4a9_caseD_72;
        case 0x73:
          goto switchD_0018e4a9_caseD_73;
        case 0x74:
          goto switchD_0018e4a9_caseD_74;
        case 0x75:
          goto switchD_0018e4a9_caseD_75;
        case 0x76:
          goto switchD_0018e4a9_caseD_76;
        case 0x77:
          goto switchD_0018e4a9_caseD_77;
        case 0x78:
          goto switchD_0018e4a9_caseD_78;
        case 0x79:
          goto switchD_0018e4a9_caseD_79;
        case 0x7a:
          goto switchD_0018e4a9_caseD_7a;
        default:
          if (keycode == 0xff09) goto LAB_0018e47f;
        }
      }
      else if ((int)keycode < 0xffe1) {
        switch(keycode) {
        case 0xff50:
          goto switchD_0018e45a_caseD_0;
        case 0xff51:
        case 0xff52:
        case 0xff53:
        case 0xff54:
          break;
        case 0xff55:
          goto switchD_0018e45a_caseD_5;
        case 0xff56:
          goto switchD_0018e45a_caseD_6;
        case 0xff57:
          goto switchD_0018e45a_caseD_7;
        default:
          if (keycode == 0xff0d) goto LAB_0018faf4;
        }
      }
      else {
        if (keycode == 0xffe1) goto switchD_0018e3bb_caseD_ffe1;
        if (keycode == 0xffe5) goto switchD_0018e3bb_caseD_ffe5;
        if (keycode == 0xffff) goto switchD_0018e3bb_caseD_ffff;
      }
      goto switchD_0018ef5d_caseD_62;
    }
switchD_0018efef_caseD_6a:
    if (0xff0c < (int)keycode) {
      if (0xff56 < (int)keycode) {
        switch(keycode) {
        case 0xffe1:
          goto switchD_0018e3bb_caseD_ffe1;
        case 0xffe2:
          goto switchD_0018e3bb_caseD_ffe2;
        case 0xffe3:
          goto switchD_0018e3bb_caseD_ffe3;
        case 0xffe4:
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          goto switchD_0018f263_caseD_65;
        case 0xffe5:
          goto switchD_0018e3bb_caseD_ffe5;
        case 0xffe9:
          goto switchD_0018e3bb_caseD_ffe9;
        case 0xffea:
          goto switchD_0018e3bb_caseD_ffea;
        case 0xffeb:
          goto switchD_0018e3bb_caseD_ffeb;
        case 0xffec:
          goto switchD_0018e3bb_caseD_ffec;
        default:
          if (keycode == 0xff57) goto switchD_0018e45a_caseD_7;
          if (keycode != 0xffff) goto switchD_0018f263_caseD_65;
          goto switchD_0018e3bb_caseD_ffff;
        }
      }
      if (keycode == 0xff0d) goto LAB_0018faf4;
      if (keycode != 0xff52) {
        if (keycode != 0xff56) goto switchD_0018f263_caseD_65;
        goto switchD_0018e45a_caseD_6;
      }
      goto switchD_0018e45a_caseD_2;
    }
    switch(keycode) {
    case 0x61:
      goto switchD_0018e4a9_caseD_61;
    case 0x62:
      goto switchD_0018e4a9_caseD_62;
    case 99:
      goto switchD_0018e4a9_caseD_63;
    case 100:
      goto switchD_0018e4a9_caseD_64;
    case 0x65:
    case 0x69:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
    case 0x77:
    case 0x79:
      goto switchD_0018f263_caseD_65;
    case 0x66:
      goto switchD_0018e4a9_caseD_66;
    case 0x67:
      goto switchD_0018e4a9_caseD_67;
    case 0x68:
      goto switchD_0018e4a9_caseD_68;
    case 0x6a:
      goto switchD_0018e4a9_caseD_6a;
    case 0x6b:
      goto switchD_0018e4a9_caseD_6b;
    case 0x6c:
      goto switchD_0018e4a9_caseD_6c;
    case 0x6d:
      goto switchD_0018e4a9_caseD_6d;
    case 0x6e:
      goto switchD_0018e4a9_caseD_6e;
    case 0x6f:
switchD_0018e4a9_caseD_6f:
      this->_is_keyO = is_pressed;
      if (0xff56 < (int)keycode) {
        if (keycode != 0xff57) {
switchD_0018e558_default:
          if (keycode == 0xffe5) goto switchD_0018e3bb_caseD_ffe5;
          if (keycode == 0xffff) goto switchD_0018e3bb_caseD_ffff;
          goto switchD_0018e8a4_caseD_62;
        }
        goto switchD_0018e45a_caseD_7;
      }
      if (keycode == 0x61) goto switchD_0018e4a9_caseD_61;
      if (keycode == 0x70) goto switchD_0018e4a9_caseD_70;
      if (keycode == 0xff56) goto switchD_0018e45a_caseD_6;
      goto switchD_0018e8a4_caseD_62;
    case 0x70:
      goto switchD_0018e4a9_caseD_70;
    case 0x73:
      goto switchD_0018e4a9_caseD_73;
    case 0x76:
      goto switchD_0018e4a9_caseD_76;
    case 0x78:
      goto switchD_0018e4a9_caseD_78;
    case 0x7a:
      goto switchD_0018e4a9_caseD_7a;
    default:
      if (keycode != 0x20) goto switchD_0018f263_caseD_65;
      goto switchD_0018e41b_caseD_20;
    }
  }
  if (100 < (int)keycode) {
    switch(keycode) {
    case 0x65:
switchD_0018e4a9_caseD_65:
      this->_is_keyE = is_pressed;
      switch(keycode) {
      case 0x69:
        goto switchD_0018e4a9_caseD_69;
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x71:
      case 0x73:
      case 0x76:
      case 0x77:
      case 0x78:
        goto switchD_0018f0ad_caseD_6a;
      case 0x6f:
        goto switchD_0018e4a9_caseD_6f;
      case 0x70:
        goto switchD_0018e4a9_caseD_70;
      case 0x72:
        goto switchD_0018e4a9_caseD_72;
      case 0x74:
        goto switchD_0018e4a9_caseD_74;
      case 0x75:
        goto switchD_0018e4a9_caseD_75;
      case 0x79:
        goto switchD_0018e4a9_caseD_79;
      default:
switchD_0018f0ad_default:
        if (keycode != 0xffff) goto switchD_0018f0ad_caseD_6a;
        goto switchD_0018e3bb_caseD_ffff;
      }
    default:
      goto switchD_0018eb86_caseD_66;
    case 0x69:
switchD_0018e4a9_caseD_69:
      this->_is_keyI = is_pressed;
      goto switchD_0018efef_caseD_6a;
    case 0x6f:
      goto switchD_0018e4a9_caseD_6f;
    case 0x70:
      goto switchD_0018e4a9_caseD_70;
    case 0x71:
switchD_0018e4a9_caseD_71:
      this->_is_keyQ = is_pressed;
      switch(keycode) {
      case 0x65:
        goto switchD_0018e4a9_caseD_65;
      default:
        goto switchD_0018f031_caseD_6a;
      case 0x69:
        goto switchD_0018e4a9_caseD_69;
      case 0x6f:
        goto switchD_0018e4a9_caseD_6f;
      case 0x70:
        goto switchD_0018e4a9_caseD_70;
      case 0x72:
        goto switchD_0018e4a9_caseD_72;
      case 0x74:
        goto switchD_0018e4a9_caseD_74;
      case 0x75:
        goto switchD_0018e4a9_caseD_75;
      case 0x77:
        goto switchD_0018e4a9_caseD_77;
      case 0x79:
        goto switchD_0018e4a9_caseD_79;
      }
    case 0x72:
switchD_0018e4a9_caseD_72:
      this->_is_keyR = is_pressed;
      switch(keycode) {
      case 0x6f:
        goto switchD_0018e4a9_caseD_6f;
      case 0x70:
        goto switchD_0018e4a9_caseD_70;
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x76:
      case 0x77:
      case 0x78:
        goto switchD_0018f0ad_caseD_6a;
      case 0x74:
        goto switchD_0018e4a9_caseD_74;
      case 0x75:
        goto switchD_0018e4a9_caseD_75;
      case 0x79:
        goto switchD_0018e4a9_caseD_79;
      default:
        if (keycode != 0x69) goto switchD_0018f0ad_default;
        goto switchD_0018e4a9_caseD_69;
      }
    case 0x74:
switchD_0018e4a9_caseD_74:
      this->_is_keyT = is_pressed;
      if ((int)keycode < 0x75) {
        if (keycode == 0x69) goto switchD_0018e4a9_caseD_69;
        if (keycode == 0x6f) goto switchD_0018e4a9_caseD_6f;
        if (keycode != 0x70) goto LAB_0018f4db;
        goto switchD_0018e4a9_caseD_70;
      }
      if ((int)keycode < 0xff57) {
        if (keycode == 0x75) goto switchD_0018e4a9_caseD_75;
        if (keycode == 0x79) goto switchD_0018e4a9_caseD_79;
      }
      else {
        if (keycode == 0xff57) goto switchD_0018e45a_caseD_7;
        if (keycode == 0xffff) goto switchD_0018e3bb_caseD_ffff;
      }
      goto LAB_0018f4db;
    case 0x75:
      goto switchD_0018e4a9_caseD_75;
    case 0x77:
switchD_0018e4a9_caseD_77:
      this->_is_keyW = is_pressed;
      switch(keycode) {
      case 0x69:
        goto switchD_0018e4a9_caseD_69;
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x71:
      case 0x73:
      case 0x76:
      case 0x77:
      case 0x78:
        break;
      case 0x6f:
        goto switchD_0018e4a9_caseD_6f;
      case 0x70:
        goto switchD_0018e4a9_caseD_70;
      case 0x72:
        goto switchD_0018e4a9_caseD_72;
      case 0x74:
        goto switchD_0018e4a9_caseD_74;
      case 0x75:
        goto switchD_0018e4a9_caseD_75;
      case 0x79:
        goto switchD_0018e4a9_caseD_79;
      default:
        if (keycode == 0x65) goto switchD_0018e4a9_caseD_65;
      }
      goto switchD_0018f031_caseD_6a;
    case 0x79:
switchD_0018e4a9_caseD_79:
      this->_is_keyY = is_pressed;
switchD_0018e8d3_caseD_73:
      if (0xff50 < (int)keycode) {
        if ((int)keycode < 0xffb2) {
          if ((int)keycode < 0xff67) {
            switch(keycode) {
            case 0xff51:
              goto switchD_0018e45a_caseD_1;
            case 0xff52:
              goto switchD_0018e45a_caseD_2;
            case 0xff53:
              goto switchD_0018e45a_caseD_3;
            case 0xff54:
              goto switchD_0018e45a_caseD_4;
            default:
              goto switchD_0018f129_caseD_65;
            case 0xff56:
              goto switchD_0018e45a_caseD_6;
            case 0xff57:
              goto switchD_0018e45a_caseD_7;
            }
          }
          if (keycode == 0xff67) goto switchD_0018e45a_caseD_17;
          if (keycode == 0xffb0) goto switchD_0018e3bb_caseD_ffb0;
          if (keycode != 0xffb1) goto switchD_0018f129_caseD_65;
          goto switchD_0018e3bb_caseD_ffb1;
        }
        switch(keycode) {
        case 0xffe1:
          goto switchD_0018e3bb_caseD_ffe1;
        case 0xffe2:
          goto switchD_0018e3bb_caseD_ffe2;
        case 0xffe3:
          goto switchD_0018e3bb_caseD_ffe3;
        case 0xffe4:
          goto switchD_0018e3bb_caseD_ffe4;
        case 0xffe5:
          goto switchD_0018e3bb_caseD_ffe5;
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          goto switchD_0018f129_caseD_65;
        case 0xffe9:
          goto switchD_0018e3bb_caseD_ffe9;
        case 0xffea:
          goto switchD_0018e3bb_caseD_ffea;
        case 0xffeb:
          goto switchD_0018e3bb_caseD_ffeb;
        case 0xffec:
          goto switchD_0018e3bb_caseD_ffec;
        default:
          if (keycode != 0xffb2) {
            if (keycode == 0xffff) goto switchD_0018e3bb_caseD_ffff;
            goto switchD_0018f129_caseD_65;
          }
        }
        goto switchD_0018e3bb_caseD_ffb2;
      }
      switch(keycode) {
      case 0x61:
        goto switchD_0018e4a9_caseD_61;
      case 0x62:
        goto switchD_0018e4a9_caseD_62;
      case 99:
        goto switchD_0018e4a9_caseD_63;
      case 100:
        goto switchD_0018e4a9_caseD_64;
      case 0x65:
      case 0x71:
      case 0x72:
      case 0x74:
      case 0x77:
      case 0x79:
        break;
      case 0x66:
        goto switchD_0018e4a9_caseD_66;
      case 0x67:
        goto switchD_0018e4a9_caseD_67;
      case 0x68:
        goto switchD_0018e4a9_caseD_68;
      case 0x69:
        goto switchD_0018e4a9_caseD_69;
      case 0x6a:
        goto switchD_0018e4a9_caseD_6a;
      case 0x6b:
        goto switchD_0018e4a9_caseD_6b;
      case 0x6c:
        goto switchD_0018e4a9_caseD_6c;
      case 0x6d:
        goto switchD_0018e4a9_caseD_6d;
      case 0x6e:
        goto switchD_0018e4a9_caseD_6e;
      case 0x6f:
        goto switchD_0018e4a9_caseD_6f;
      case 0x70:
        goto switchD_0018e4a9_caseD_70;
      case 0x73:
        goto switchD_0018e4a9_caseD_73;
      case 0x75:
        goto switchD_0018e4a9_caseD_75;
      case 0x76:
        goto switchD_0018e4a9_caseD_76;
      case 0x78:
        goto switchD_0018e4a9_caseD_78;
      case 0x7a:
        goto switchD_0018e4a9_caseD_7a;
      default:
        if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
        if (keycode == 0xff0d) goto LAB_0018faf4;
      }
      goto switchD_0018f129_caseD_65;
    }
  }
  if (keycode == 0x30) {
switchD_0018e41b_caseD_30:
    this->_is_key0 = is_pressed;
switchD_0018eb12_caseD_31:
    if ((int)keycode < 0xff09) {
      switch(keycode) {
      case 0x61:
        goto switchD_0018e4a9_caseD_61;
      case 0x62:
      case 99:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x76:
      case 0x78:
        break;
      case 100:
        goto switchD_0018e4a9_caseD_64;
      case 0x65:
        goto switchD_0018e4a9_caseD_65;
      case 0x66:
        goto switchD_0018e4a9_caseD_66;
      case 0x67:
        goto switchD_0018e4a9_caseD_67;
      case 0x68:
        goto switchD_0018e4a9_caseD_68;
      case 0x69:
        goto switchD_0018e4a9_caseD_69;
      case 0x6f:
        goto switchD_0018e4a9_caseD_6f;
      case 0x70:
        goto switchD_0018e4a9_caseD_70;
      case 0x71:
        goto switchD_0018e4a9_caseD_71;
      case 0x72:
        goto switchD_0018e4a9_caseD_72;
      case 0x73:
        goto switchD_0018e4a9_caseD_73;
      case 0x74:
        goto switchD_0018e4a9_caseD_74;
      case 0x75:
        goto switchD_0018e4a9_caseD_75;
      case 0x77:
        goto switchD_0018e4a9_caseD_77;
      case 0x79:
        goto switchD_0018e4a9_caseD_79;
      default:
        if (keycode == 0xff08) goto LAB_0018ee28;
      }
    }
    else if ((int)keycode < 0xff63) {
      switch(keycode) {
      case 0xff50:
        goto switchD_0018e45a_caseD_0;
      case 0xff51:
      case 0xff52:
      case 0xff53:
      case 0xff54:
        break;
      case 0xff55:
        goto switchD_0018e45a_caseD_5;
      case 0xff56:
        goto switchD_0018e45a_caseD_6;
      case 0xff57:
        goto switchD_0018e45a_caseD_7;
      default:
        if (keycode == 0xff09) goto LAB_0018e47f;
      }
    }
    else {
      if (keycode == 0xff63) goto switchD_0018e45a_caseD_13;
      if (keycode == 0xffe5) goto switchD_0018e3bb_caseD_ffe5;
      if (keycode == 0xffff) goto switchD_0018e3bb_caseD_ffff;
    }
    goto switchD_0018edb6_caseD_62;
  }
  if (keycode == 0x38) {
switchD_0018eaa9_caseD_38:
    this->_is_key8 = is_pressed;
switchD_0018eaa9_default:
    if ((int)keycode < 0xff08) {
      switch(keycode) {
      case 0x61:
        goto switchD_0018e4a9_caseD_61;
      case 0x62:
      case 99:
      case 0x67:
      case 0x68:
      case 0x6a:
      case 0x6b:
      case 0x6c:
      case 0x6d:
      case 0x6e:
      case 0x76:
      case 0x78:
        break;
      case 100:
        goto switchD_0018e4a9_caseD_64;
      case 0x65:
        goto switchD_0018e4a9_caseD_65;
      case 0x66:
        goto switchD_0018e4a9_caseD_66;
      case 0x69:
        goto switchD_0018e4a9_caseD_69;
      case 0x6f:
        goto switchD_0018e4a9_caseD_6f;
      case 0x70:
        goto switchD_0018e4a9_caseD_70;
      case 0x71:
        goto switchD_0018e4a9_caseD_71;
      case 0x72:
        goto switchD_0018e4a9_caseD_72;
      case 0x73:
        goto switchD_0018e4a9_caseD_73;
      case 0x74:
        goto switchD_0018e4a9_caseD_74;
      case 0x75:
        goto switchD_0018e4a9_caseD_75;
      case 0x77:
        goto switchD_0018e4a9_caseD_77;
      case 0x79:
        goto switchD_0018e4a9_caseD_79;
      default:
        if (keycode == 0x30) goto switchD_0018e41b_caseD_30;
        if (keycode == 0x39) goto switchD_0018e41b_caseD_39;
      }
    }
    else if ((int)keycode < 0xff63) {
      switch(keycode) {
      case 0xff50:
        goto switchD_0018e45a_caseD_0;
      case 0xff51:
      case 0xff52:
      case 0xff53:
      case 0xff54:
        break;
      case 0xff55:
        goto switchD_0018e45a_caseD_5;
      case 0xff56:
        goto switchD_0018e45a_caseD_6;
      case 0xff57:
        goto switchD_0018e45a_caseD_7;
      default:
        if (keycode == 0xff08) goto LAB_0018ee28;
        if (keycode == 0xff09) goto LAB_0018e47f;
      }
    }
    else {
      if (keycode == 0xff63) goto switchD_0018e45a_caseD_13;
      if (keycode == 0xffe5) goto switchD_0018e3bb_caseD_ffe5;
      if (keycode == 0xffff) goto switchD_0018e3bb_caseD_ffff;
    }
    goto switchD_0018ec1d_caseD_62;
  }
  if (keycode != 0x39) goto switchD_0018eb86_caseD_66;
switchD_0018e41b_caseD_39:
  this->_is_key9 = is_pressed;
switchD_0018eacc_default:
  if ((int)keycode < 0xff08) {
    if (keycode - 0x61 < 0x19) {
      pCVar2 = (CImgDisplay *)
               (*(code *)(&DAT_0024fc00 + *(int *)(&DAT_0024fc00 + (ulong)(keycode - 0x61) * 4)))();
      return pCVar2;
    }
    if (keycode == 0x30) goto switchD_0018e41b_caseD_30;
  }
  else if ((int)keycode < 0xff63) {
    if (keycode - 0xff50 < 8) {
      pCVar2 = (CImgDisplay *)
               (*(code *)(&DAT_0024fc64 + *(int *)(&DAT_0024fc64 + (ulong)(keycode - 0xff50) * 4)))
                         ();
      return pCVar2;
    }
    if (keycode == 0xff08) goto LAB_0018ee28;
    if (keycode == 0xff09) goto LAB_0018e47f;
  }
  else {
    if (keycode == 0xff63) goto switchD_0018e45a_caseD_13;
    if (keycode == 0xffe5) goto switchD_0018e3bb_caseD_ffe5;
    if (keycode == 0xffff) goto switchD_0018e3bb_caseD_ffff;
  }
LAB_0018f719:
  if (0xff66 < (int)keycode) {
    if (keycode - 0xffaa < 0x10) {
      pCVar2 = (CImgDisplay *)
               (*(code *)(&DAT_002506e4 + *(int *)(&DAT_002506e4 + (ulong)(keycode - 0xffaa) * 4)))
                         ();
      return pCVar2;
    }
    if (keycode - 0xffe1 < 0xc) {
      pCVar2 = (CImgDisplay *)
               (*(code *)(&DAT_00250724 + *(int *)(&DAT_00250724 + (ulong)(keycode - 0xffe1) * 4)))
                         ();
      return pCVar2;
    }
    goto switchD_0018ffe4_default;
  }
  if ((int)keycode < 0xff0d) {
    if (keycode - 0x62 < 0x19) {
      pCVar2 = (CImgDisplay *)
               (*(code *)(&DAT_00250670 + *(int *)(&DAT_00250670 + (ulong)(keycode - 0x62) * 4)))();
      return pCVar2;
    }
switchD_0018f7c3_default:
    if (keycode == 0x20) {
switchD_0018e41b_caseD_20:
      this->_is_keySPACE = is_pressed;
switchD_0018ee73_caseD_ff51:
      if ((int)keycode < 0xffaa) {
LAB_00190127:
        if (0xff53 < (int)keycode) {
          if (keycode != 0xff54) goto switchD_0018ffe4_default;
          goto switchD_0018e45a_caseD_4;
        }
        if (keycode == 0xff51) goto switchD_0018e45a_caseD_1;
        if (keycode == 0xff53) goto switchD_0018e45a_caseD_3;
      }
      else if ((int)keycode < 0xffe4) {
        switch(keycode) {
        case 0xffaa:
          goto switchD_0018e3bb_caseD_ffaa;
        case 0xffab:
          goto switchD_0018e3bb_caseD_ffab;
        case 0xffad:
          goto switchD_0018e3bb_caseD_ffad;
        case 0xffaf:
          goto switchD_0018e3bb_caseD_ffaf;
        case 0xffb0:
          goto switchD_0018e3bb_caseD_ffb0;
        case 0xffb1:
          goto switchD_0018e3bb_caseD_ffb1;
        case 0xffb2:
          goto switchD_0018e3bb_caseD_ffb2;
        case 0xffb3:
          goto switchD_0018e3bb_caseD_ffb3;
        case 0xffb4:
          goto switchD_0018e3bb_caseD_ffb4;
        case 0xffb5:
          goto switchD_0018e3bb_caseD_ffb5;
        case 0xffb6:
          goto switchD_0018e3bb_caseD_ffb6;
        case 0xffb7:
          goto switchD_0018e3bb_caseD_ffb7;
        case 0xffb8:
          goto switchD_0018e3bb_caseD_ffb8;
        case 0xffb9:
          goto switchD_0018e3bb_caseD_ffb9;
        }
      }
      else {
        if (keycode == 0xffe4) goto switchD_0018e3bb_caseD_ffe4;
        if (keycode == 0xffec) goto switchD_0018e3bb_caseD_ffec;
        if (keycode == 0xffea) goto switchD_0018e3bb_caseD_ffea;
      }
    }
    goto switchD_0018e3bb_caseD_ffac;
  }
  if (keycode - 0xff51 < 4) {
    pCVar2 = (CImgDisplay *)
             (*(code *)(&DAT_002506d4 + *(int *)(&DAT_002506d4 + (ulong)(keycode - 0xff51) * 4)))();
    return pCVar2;
  }
switchD_0018fae5_default:
  if (keycode != 0xff0d) goto switchD_0018e3bb_caseD_ffac;
LAB_0018faf4:
  this->_is_keyENTER = is_pressed;
switchD_0018f6b8_caseD_69:
  if ((int)keycode < 0xff67) {
    if (0x77 < (int)keycode) {
      switch(keycode) {
      case 0xff51:
        goto switchD_0018e45a_caseD_1;
      case 0xff52:
switchD_0018e45a_caseD_2:
        this->_is_keyARROWUP = is_pressed;
        switch(keycode) {
        case 0xffe3:
          goto switchD_0018e3bb_caseD_ffe3;
        case 0xffe4:
        case 0xffe5:
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          break;
        case 0xffe9:
          goto switchD_0018e3bb_caseD_ffe9;
        case 0xffea:
          goto switchD_0018e3bb_caseD_ffea;
        case 0xffeb:
          goto switchD_0018e3bb_caseD_ffeb;
        default:
          if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
        }
        goto switchD_0018ff16_caseD_ffe4;
      case 0xff53:
        goto switchD_0018e45a_caseD_3;
      case 0xff54:
        goto switchD_0018e45a_caseD_4;
      default:
        if (keycode == 0x78) {
switchD_0018e4a9_caseD_78:
          this->_is_keyX = is_pressed;
          if ((int)keycode < 0x6d) {
            if (keycode == 0x62) goto switchD_0018e4a9_caseD_62;
            if (keycode == 99) goto switchD_0018e4a9_caseD_63;
          }
          else {
            if (keycode == 0x6d) goto switchD_0018e4a9_caseD_6d;
            if (keycode == 0x6e) goto switchD_0018e4a9_caseD_6e;
            if (keycode == 0x76) goto switchD_0018e4a9_caseD_76;
          }
        }
        else {
          if (keycode != 0x7a) goto switchD_0018e3bb_caseD_ffac;
switchD_0018e4a9_caseD_7a:
          this->_is_keyZ = is_pressed;
          if ((int)keycode < 0x6e) {
            if (keycode == 0x62) goto switchD_0018e4a9_caseD_62;
            if (keycode == 99) goto switchD_0018e4a9_caseD_63;
            if (keycode == 0x6d) goto switchD_0018e4a9_caseD_6d;
          }
          else {
            if (keycode == 0x6e) goto switchD_0018e4a9_caseD_6e;
            if (keycode == 0x76) goto switchD_0018e4a9_caseD_76;
            if (keycode == 0x78) goto switchD_0018e4a9_caseD_78;
          }
        }
LAB_0018fdf8:
        if ((int)keycode < 0xffaa) {
          switch(keycode) {
          case 0xff51:
            goto switchD_0018e45a_caseD_1;
          case 0xff52:
            goto switchD_0018e45a_caseD_2;
          case 0xff53:
            goto switchD_0018e45a_caseD_3;
          case 0xff54:
            goto switchD_0018e45a_caseD_4;
          default:
            if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
            goto switchD_0018ffe4_default;
          }
        }
        switch(keycode) {
        case 0xffaa:
          goto switchD_0018e3bb_caseD_ffaa;
        case 0xffab:
          goto switchD_0018e3bb_caseD_ffab;
        case 0xffac:
        case 0xffae:
          break;
        case 0xffad:
          goto switchD_0018e3bb_caseD_ffad;
        case 0xffaf:
          goto switchD_0018e3bb_caseD_ffaf;
        case 0xffb0:
          goto switchD_0018e3bb_caseD_ffb0;
        case 0xffb1:
          goto switchD_0018e3bb_caseD_ffb1;
        case 0xffb2:
          goto switchD_0018e3bb_caseD_ffb2;
        case 0xffb3:
          goto switchD_0018e3bb_caseD_ffb3;
        case 0xffb4:
          goto switchD_0018e3bb_caseD_ffb4;
        case 0xffb5:
          goto switchD_0018e3bb_caseD_ffb5;
        case 0xffb6:
          goto switchD_0018e3bb_caseD_ffb6;
        case 0xffb7:
          goto switchD_0018e3bb_caseD_ffb7;
        case 0xffb8:
          goto switchD_0018e3bb_caseD_ffb8;
        case 0xffb9:
          goto switchD_0018e3bb_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe2:
            goto switchD_0018e3bb_caseD_ffe2;
          case 0xffe3:
            goto switchD_0018e3bb_caseD_ffe3;
          case 0xffe4:
            goto switchD_0018e3bb_caseD_ffe4;
          case 0xffe9:
            goto switchD_0018e3bb_caseD_ffe9;
          case 0xffea:
            goto switchD_0018e3bb_caseD_ffea;
          case 0xffeb:
            goto switchD_0018e3bb_caseD_ffeb;
          case 0xffec:
            goto switchD_0018e3bb_caseD_ffec;
          }
        }
        goto switchD_0018e3bb_caseD_ffac;
      }
    }
    if ((int)keycode < 0x6d) {
LAB_0018fb2b:
      if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
      if (keycode == 0x62) goto switchD_0018e4a9_caseD_62;
      if (keycode == 99) goto switchD_0018e4a9_caseD_63;
    }
    else {
      if (keycode == 0x6d) {
switchD_0018e4a9_caseD_6d:
        this->_is_keyM = is_pressed;
        goto LAB_0018fdf8;
      }
switchD_0018fc84_default:
      if (keycode == 0x6e) {
switchD_0018e4a9_caseD_6e:
        this->_is_keyN = is_pressed;
        goto LAB_0018fdb5;
      }
      if (keycode == 0x76) goto switchD_0018e4a9_caseD_76;
    }
    goto switchD_0018e3bb_caseD_ffac;
  }
  switch(keycode) {
  case 0xffaa:
    goto switchD_0018e3bb_caseD_ffaa;
  case 0xffab:
    goto switchD_0018e3bb_caseD_ffab;
  case 0xffac:
  case 0xffae:
    goto switchD_0018e3bb_caseD_ffac;
  case 0xffad:
    goto switchD_0018e3bb_caseD_ffad;
  case 0xffaf:
    goto switchD_0018e3bb_caseD_ffaf;
  case 0xffb0:
    goto switchD_0018e3bb_caseD_ffb0;
  case 0xffb1:
    goto switchD_0018e3bb_caseD_ffb1;
  case 0xffb2:
    goto switchD_0018e3bb_caseD_ffb2;
  case 0xffb3:
    goto switchD_0018e3bb_caseD_ffb3;
  case 0xffb4:
    goto switchD_0018e3bb_caseD_ffb4;
  case 0xffb5:
    goto switchD_0018e3bb_caseD_ffb5;
  case 0xffb6:
    goto switchD_0018e3bb_caseD_ffb6;
  case 0xffb7:
    goto switchD_0018e3bb_caseD_ffb7;
  case 0xffb8:
    goto switchD_0018e3bb_caseD_ffb8;
  case 0xffb9:
    goto switchD_0018e3bb_caseD_ffb9;
  }
  switch(keycode) {
  case 0xffe1:
switchD_0018e3bb_caseD_ffe1:
    this->_is_keySHIFTLEFT = is_pressed;
    if ((int)keycode < 0x76) {
      if (keycode != 0x62) {
        if (keycode == 99) {
switchD_0018e4a9_caseD_63:
          this->_is_keyC = is_pressed;
LAB_0018fc3b:
          if (0xff66 < (int)keycode) {
            switch(keycode) {
            case 0xffaa:
              goto switchD_0018e3bb_caseD_ffaa;
            case 0xffab:
              goto switchD_0018e3bb_caseD_ffab;
            case 0xffac:
            case 0xffae:
              goto switchD_0018e3bb_caseD_ffac;
            case 0xffad:
              goto switchD_0018e3bb_caseD_ffad;
            case 0xffaf:
              goto switchD_0018e3bb_caseD_ffaf;
            case 0xffb0:
              goto switchD_0018e3bb_caseD_ffb0;
            case 0xffb1:
              goto switchD_0018e3bb_caseD_ffb1;
            case 0xffb2:
              goto switchD_0018e3bb_caseD_ffb2;
            case 0xffb3:
              goto switchD_0018e3bb_caseD_ffb3;
            case 0xffb4:
              goto switchD_0018e3bb_caseD_ffb4;
            case 0xffb5:
              goto switchD_0018e3bb_caseD_ffb5;
            case 0xffb6:
              goto switchD_0018e3bb_caseD_ffb6;
            case 0xffb7:
              goto switchD_0018e3bb_caseD_ffb7;
            case 0xffb8:
              goto switchD_0018e3bb_caseD_ffb8;
            case 0xffb9:
              goto switchD_0018e3bb_caseD_ffb9;
            default:
              switch(keycode) {
              case 0xffe2:
                goto switchD_0018e3bb_caseD_ffe2;
              case 0xffe3:
                goto switchD_0018e3bb_caseD_ffe3;
              case 0xffe4:
                goto switchD_0018e3bb_caseD_ffe4;
              case 0xffe5:
              case 0xffe6:
              case 0xffe7:
              case 0xffe8:
                goto switchD_0018e3bb_caseD_ffac;
              case 0xffe9:
                goto switchD_0018e3bb_caseD_ffe9;
              case 0xffea:
                goto switchD_0018e3bb_caseD_ffea;
              case 0xffeb:
                goto switchD_0018e3bb_caseD_ffeb;
              case 0xffec:
                goto switchD_0018e3bb_caseD_ffec;
              default:
                goto switchD_0018ffe4_default;
              }
            }
          }
          if (0x6d < (int)keycode) {
            switch(keycode) {
            case 0xff51:
              goto switchD_0018e45a_caseD_1;
            case 0xff52:
              goto switchD_0018e45a_caseD_2;
            case 0xff53:
              goto switchD_0018e45a_caseD_3;
            case 0xff54:
              goto switchD_0018e45a_caseD_4;
            default:
              goto switchD_0018fc84_default;
            }
          }
          goto LAB_0018fd05;
        }
        if (keycode == 0x6e) goto switchD_0018e4a9_caseD_6e;
        goto LAB_0018fdb5;
      }
switchD_0018e4a9_caseD_62:
      this->_is_keyB = is_pressed;
      if ((int)keycode < 0xff52) {
        if (keycode == 0x6d) goto switchD_0018e4a9_caseD_6d;
        if (keycode == 0x6e) goto switchD_0018e4a9_caseD_6e;
      }
      else {
        if (keycode == 0xff52) goto switchD_0018e45a_caseD_2;
        if (keycode == 0xffe2) goto switchD_0018e3bb_caseD_ffe2;
        if (keycode == 0xffe3) goto switchD_0018e3bb_caseD_ffe3;
      }
      goto LAB_0018ff1e;
    }
    if (keycode == 0x76) {
switchD_0018e4a9_caseD_76:
      this->_is_keyV = is_pressed;
switchD_0018ef5d_caseD_62:
      if (0xff66 < (int)keycode) {
        switch(keycode) {
        case 0xffaa:
          goto switchD_0018e3bb_caseD_ffaa;
        case 0xffab:
          goto switchD_0018e3bb_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0018e3bb_caseD_ffac;
        case 0xffad:
          goto switchD_0018e3bb_caseD_ffad;
        case 0xffaf:
          goto switchD_0018e3bb_caseD_ffaf;
        case 0xffb0:
          goto switchD_0018e3bb_caseD_ffb0;
        case 0xffb1:
          goto switchD_0018e3bb_caseD_ffb1;
        case 0xffb2:
          goto switchD_0018e3bb_caseD_ffb2;
        case 0xffb3:
          goto switchD_0018e3bb_caseD_ffb3;
        case 0xffb4:
          goto switchD_0018e3bb_caseD_ffb4;
        case 0xffb5:
          goto switchD_0018e3bb_caseD_ffb5;
        case 0xffb6:
          goto switchD_0018e3bb_caseD_ffb6;
        case 0xffb7:
          goto switchD_0018e3bb_caseD_ffb7;
        case 0xffb8:
          goto switchD_0018e3bb_caseD_ffb8;
        case 0xffb9:
          goto switchD_0018e3bb_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe2:
            goto switchD_0018e3bb_caseD_ffe2;
          case 0xffe3:
            goto switchD_0018e3bb_caseD_ffe3;
          case 0xffe4:
            goto switchD_0018e3bb_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
            goto switchD_0018e3bb_caseD_ffac;
          case 0xffe9:
            goto switchD_0018e3bb_caseD_ffe9;
          case 0xffea:
            goto switchD_0018e3bb_caseD_ffea;
          case 0xffeb:
            goto switchD_0018e3bb_caseD_ffeb;
          case 0xffec:
            goto switchD_0018e3bb_caseD_ffec;
          default:
            goto switchD_0018ffe4_default;
          }
        }
      }
      if ((int)keycode < 0x6e) {
LAB_0018fd05:
        if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
        if (keycode == 0x62) goto switchD_0018e4a9_caseD_62;
        goto LAB_0018fde8;
      }
      switch(keycode) {
      case 0xff51:
        goto switchD_0018e45a_caseD_1;
      case 0xff52:
        goto switchD_0018e45a_caseD_2;
      case 0xff53:
        goto switchD_0018e45a_caseD_3;
      case 0xff54:
        goto switchD_0018e45a_caseD_4;
      default:
switchD_0018fda3_default:
        if (keycode == 0x6e) goto switchD_0018e4a9_caseD_6e;
      }
    }
    else {
      if (keycode == 0x78) goto switchD_0018e4a9_caseD_78;
      if (keycode == 0x7a) goto switchD_0018e4a9_caseD_7a;
LAB_0018fdb5:
      if (0xff66 < (int)keycode) {
        switch(keycode) {
        case 0xffaa:
          goto switchD_0018e3bb_caseD_ffaa;
        case 0xffab:
          goto switchD_0018e3bb_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0018e3bb_caseD_ffac;
        case 0xffad:
          goto switchD_0018e3bb_caseD_ffad;
        case 0xffaf:
          goto switchD_0018e3bb_caseD_ffaf;
        case 0xffb0:
          goto switchD_0018e3bb_caseD_ffb0;
        case 0xffb1:
          goto switchD_0018e3bb_caseD_ffb1;
        case 0xffb2:
          goto switchD_0018e3bb_caseD_ffb2;
        case 0xffb3:
          goto switchD_0018e3bb_caseD_ffb3;
        case 0xffb4:
          goto switchD_0018e3bb_caseD_ffb4;
        case 0xffb5:
          goto switchD_0018e3bb_caseD_ffb5;
        case 0xffb6:
          goto switchD_0018e3bb_caseD_ffb6;
        case 0xffb7:
          goto switchD_0018e3bb_caseD_ffb7;
        case 0xffb8:
          goto switchD_0018e3bb_caseD_ffb8;
        case 0xffb9:
          goto switchD_0018e3bb_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe2:
            goto switchD_0018e3bb_caseD_ffe2;
          case 0xffe3:
            goto switchD_0018e3bb_caseD_ffe3;
          case 0xffe4:
            goto switchD_0018e3bb_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
            goto switchD_0018e3bb_caseD_ffac;
          case 0xffe9:
            goto switchD_0018e3bb_caseD_ffe9;
          case 0xffea:
            goto switchD_0018e3bb_caseD_ffea;
          case 0xffeb:
            goto switchD_0018e3bb_caseD_ffeb;
          case 0xffec:
            goto switchD_0018e3bb_caseD_ffec;
          default:
            goto switchD_0018ffe4_default;
          }
        }
      }
      switch(keycode) {
      case 0xff51:
        goto switchD_0018e45a_caseD_1;
      case 0xff52:
        goto switchD_0018e45a_caseD_2;
      case 0xff53:
        goto switchD_0018e45a_caseD_3;
      case 0xff54:
        goto switchD_0018e45a_caseD_4;
      default:
        if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
      }
LAB_0018fde8:
      if (keycode == 0x6d) goto switchD_0018e4a9_caseD_6d;
    }
    break;
  case 0xffe2:
switchD_0018e3bb_caseD_ffe2:
    this->_is_keySHIFTRIGHT = is_pressed;
    if ((int)keycode < 0xffe3) {
      if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
      if (keycode == 0xff52) goto switchD_0018e45a_caseD_2;
    }
    else {
      if (keycode == 0xffe3) goto switchD_0018e3bb_caseD_ffe3;
      if (keycode == 0xffe9) goto switchD_0018e3bb_caseD_ffe9;
      if (keycode == 0xffeb) goto switchD_0018e3bb_caseD_ffeb;
    }
    goto switchD_0018ee73_caseD_ff51;
  case 0xffe3:
switchD_0018e3bb_caseD_ffe3:
    this->_is_keyCTRLLEFT = is_pressed;
LAB_0018ff1e:
    if (0xff66 < (int)keycode) {
      switch(keycode) {
      case 0xffaa:
        goto switchD_0018e3bb_caseD_ffaa;
      case 0xffab:
        goto switchD_0018e3bb_caseD_ffab;
      case 0xffac:
      case 0xffae:
        goto switchD_0018e3bb_caseD_ffac;
      case 0xffad:
        goto switchD_0018e3bb_caseD_ffad;
      case 0xffaf:
        goto switchD_0018e3bb_caseD_ffaf;
      case 0xffb0:
        goto switchD_0018e3bb_caseD_ffb0;
      case 0xffb1:
        goto switchD_0018e3bb_caseD_ffb1;
      case 0xffb2:
        goto switchD_0018e3bb_caseD_ffb2;
      case 0xffb3:
        goto switchD_0018e3bb_caseD_ffb3;
      case 0xffb4:
        goto switchD_0018e3bb_caseD_ffb4;
      case 0xffb5:
        goto switchD_0018e3bb_caseD_ffb5;
      case 0xffb6:
        goto switchD_0018e3bb_caseD_ffb6;
      case 0xffb7:
        goto switchD_0018e3bb_caseD_ffb7;
      case 0xffb8:
        goto switchD_0018e3bb_caseD_ffb8;
      case 0xffb9:
        goto switchD_0018e3bb_caseD_ffb9;
      default:
        switch(keycode) {
        case 0xffe4:
          goto switchD_0018e3bb_caseD_ffe4;
        case 0xffe5:
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          goto switchD_0018e3bb_caseD_ffac;
        case 0xffe9:
          goto switchD_0018e3bb_caseD_ffe9;
        case 0xffea:
          goto switchD_0018e3bb_caseD_ffea;
        case 0xffeb:
          goto switchD_0018e3bb_caseD_ffeb;
        case 0xffec:
          goto switchD_0018e3bb_caseD_ffec;
        default:
          goto switchD_0018ffe4_default;
        }
      }
    }
    goto LAB_0018ff8e;
  case 0xffe4:
switchD_0018e3bb_caseD_ffe4:
    this->_is_keyCTRLRIGHT = is_pressed;
    goto switchD_0018e52b_caseD_ffe6;
  case 0xffe5:
  case 0xffe6:
  case 0xffe7:
  case 0xffe8:
    break;
  case 0xffe9:
switchD_0018e3bb_caseD_ffe9:
    this->_is_keyALT = is_pressed;
    if (0xffe3 < (int)keycode) {
      if (keycode != 0xffe4) {
        if (keycode == 0xffea) goto switchD_0018e3bb_caseD_ffea;
        if (keycode != 0xffec) goto switchD_0018e52b_caseD_ffe6;
        goto switchD_0018e3bb_caseD_ffec;
      }
      goto switchD_0018e3bb_caseD_ffe4;
    }
    if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
    if (keycode == 0xff67) goto switchD_0018e45a_caseD_17;
switchD_0018e52b_caseD_ffe6:
    if ((int)keycode < 0xffaa) {
LAB_00190221:
      if (keycode == 0xff51) {
switchD_0018e45a_caseD_1:
        this->_is_keyARROWLEFT = is_pressed;
switchD_0018f497_caseD_65:
        switch(keycode) {
        case 0xffaa:
          goto switchD_0018e3bb_caseD_ffaa;
        case 0xffab:
          goto switchD_0018e3bb_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0018e3bb_caseD_ffac;
        case 0xffad:
          goto switchD_0018e3bb_caseD_ffad;
        case 0xffaf:
          goto switchD_0018e3bb_caseD_ffaf;
        case 0xffb0:
          goto switchD_0018e3bb_caseD_ffb0;
        case 0xffb1:
          goto switchD_0018e3bb_caseD_ffb1;
        case 0xffb2:
          goto switchD_0018e3bb_caseD_ffb2;
        case 0xffb3:
          goto switchD_0018e3bb_caseD_ffb3;
        case 0xffb4:
          goto switchD_0018e3bb_caseD_ffb4;
        case 0xffb5:
          goto switchD_0018e3bb_caseD_ffb5;
        case 0xffb6:
          goto switchD_0018e3bb_caseD_ffb6;
        case 0xffb7:
          goto switchD_0018e3bb_caseD_ffb7;
        case 0xffb8:
          goto switchD_0018e3bb_caseD_ffb8;
        case 0xffb9:
          goto switchD_0018e3bb_caseD_ffb9;
        }
      }
switchD_00190263_default:
      if (keycode == 0xff53) {
switchD_0018e45a_caseD_3:
        this->_is_keyARROWRIGHT = is_pressed;
LAB_001902b0:
        switch(keycode) {
        case 0xffaa:
          goto switchD_0018e3bb_caseD_ffaa;
        case 0xffab:
          goto switchD_0018e3bb_caseD_ffab;
        case 0xffad:
          goto switchD_0018e3bb_caseD_ffad;
        case 0xffaf:
          goto switchD_0018e3bb_caseD_ffaf;
        case 0xffb0:
          goto switchD_0018e3bb_caseD_ffb0;
        case 0xffb1:
          goto switchD_0018e3bb_caseD_ffb1;
        case 0xffb2:
          goto switchD_0018e3bb_caseD_ffb2;
        case 0xffb3:
          goto switchD_0018e3bb_caseD_ffb3;
        case 0xffb4:
          goto switchD_0018e3bb_caseD_ffb4;
        case 0xffb5:
          goto switchD_0018e3bb_caseD_ffb5;
        case 0xffb6:
          goto switchD_0018e3bb_caseD_ffb6;
        case 0xffb7:
          goto switchD_0018e3bb_caseD_ffb7;
        case 0xffb8:
          goto switchD_0018e3bb_caseD_ffb8;
        case 0xffb9:
          goto switchD_0018e3bb_caseD_ffb9;
        }
      }
      else if (keycode == 0xff54) {
switchD_0018e45a_caseD_4:
        this->_is_keyARROWDOWN = is_pressed;
        switch(keycode) {
        case 0xffb0:
          goto switchD_0018e3bb_caseD_ffb0;
        case 0xffb1:
          goto switchD_0018e3bb_caseD_ffb1;
        case 0xffb2:
          goto switchD_0018e3bb_caseD_ffb2;
        case 0xffb3:
          goto switchD_0018e3bb_caseD_ffb3;
        }
        if (keycode == 0xff53) goto switchD_0018e45a_caseD_3;
        goto LAB_00190348;
      }
      break;
    }
    switch(keycode) {
    case 0xffaa:
      goto switchD_0018e3bb_caseD_ffaa;
    case 0xffab:
switchD_0018e3bb_caseD_ffab:
      this->_is_keyPADADD = is_pressed;
      goto LAB_00190489;
    case 0xffad:
      goto switchD_0018e3bb_caseD_ffad;
    case 0xffaf:
      goto switchD_0018e3bb_caseD_ffaf;
    case 0xffb0:
switchD_0018e3bb_caseD_ffb0:
      this->_is_keyPAD0 = is_pressed;
LAB_001902d6:
      switch(keycode) {
      case 0xffaa:
        goto switchD_0018e3bb_caseD_ffaa;
      case 0xffab:
        goto switchD_0018e3bb_caseD_ffab;
      case 0xffad:
        goto switchD_0018e3bb_caseD_ffad;
      case 0xffaf:
        goto switchD_0018e3bb_caseD_ffaf;
      case 0xffb1:
        goto switchD_0018e3bb_caseD_ffb1;
      case 0xffb2:
        goto switchD_0018e3bb_caseD_ffb2;
      case 0xffb3:
        goto switchD_0018e3bb_caseD_ffb3;
      case 0xffb4:
        goto switchD_0018e3bb_caseD_ffb4;
      case 0xffb5:
        goto switchD_0018e3bb_caseD_ffb5;
      case 0xffb6:
        goto switchD_0018e3bb_caseD_ffb6;
      case 0xffb7:
        goto switchD_0018e3bb_caseD_ffb7;
      case 0xffb8:
        goto switchD_0018e3bb_caseD_ffb8;
      case 0xffb9:
        goto switchD_0018e3bb_caseD_ffb9;
      }
      break;
    case 0xffb1:
switchD_0018e3bb_caseD_ffb1:
      this->_is_keyPAD1 = is_pressed;
switchD_0018f5ff_caseD_65:
      switch(keycode) {
      case 0xffaa:
        goto switchD_0018e3bb_caseD_ffaa;
      case 0xffab:
        goto switchD_0018e3bb_caseD_ffab;
      case 0xffad:
        goto switchD_0018e3bb_caseD_ffad;
      case 0xffaf:
        goto switchD_0018e3bb_caseD_ffaf;
      case 0xffb2:
        goto switchD_0018e3bb_caseD_ffb2;
      case 0xffb3:
        goto switchD_0018e3bb_caseD_ffb3;
      case 0xffb4:
        goto switchD_0018e3bb_caseD_ffb4;
      case 0xffb5:
        goto switchD_0018e3bb_caseD_ffb5;
      case 0xffb6:
        goto switchD_0018e3bb_caseD_ffb6;
      case 0xffb7:
        goto switchD_0018e3bb_caseD_ffb7;
      case 0xffb8:
        goto switchD_0018e3bb_caseD_ffb8;
      case 0xffb9:
        goto switchD_0018e3bb_caseD_ffb9;
      }
      break;
    case 0xffb2:
switchD_0018e3bb_caseD_ffb2:
      this->_is_keyPAD2 = is_pressed;
switchD_0018f129_caseD_65:
      switch(keycode) {
      case 0xffaa:
        goto switchD_0018e3bb_caseD_ffaa;
      case 0xffab:
        goto switchD_0018e3bb_caseD_ffab;
      case 0xffad:
        goto switchD_0018e3bb_caseD_ffad;
      case 0xffaf:
        goto switchD_0018e3bb_caseD_ffaf;
      case 0xffb3:
        goto switchD_0018e3bb_caseD_ffb3;
      case 0xffb4:
        goto switchD_0018e3bb_caseD_ffb4;
      case 0xffb5:
        goto switchD_0018e3bb_caseD_ffb5;
      case 0xffb6:
        goto switchD_0018e3bb_caseD_ffb6;
      case 0xffb7:
        goto switchD_0018e3bb_caseD_ffb7;
      case 0xffb8:
        goto switchD_0018e3bb_caseD_ffb8;
      case 0xffb9:
        goto switchD_0018e3bb_caseD_ffb9;
      }
      break;
    case 0xffb3:
switchD_0018e3bb_caseD_ffb3:
      this->_is_keyPAD3 = is_pressed;
LAB_00190348:
      switch(keycode) {
      case 0xffaa:
        goto switchD_0018e3bb_caseD_ffaa;
      case 0xffab:
        goto switchD_0018e3bb_caseD_ffab;
      case 0xffad:
        goto switchD_0018e3bb_caseD_ffad;
      case 0xffaf:
        goto switchD_0018e3bb_caseD_ffaf;
      case 0xffb4:
        goto switchD_0018e3bb_caseD_ffb4;
      case 0xffb5:
        goto switchD_0018e3bb_caseD_ffb5;
      case 0xffb6:
        goto switchD_0018e3bb_caseD_ffb6;
      case 0xffb7:
        goto switchD_0018e3bb_caseD_ffb7;
      case 0xffb8:
        goto switchD_0018e3bb_caseD_ffb8;
      case 0xffb9:
        goto switchD_0018e3bb_caseD_ffb9;
      }
      break;
    case 0xffb4:
switchD_0018e3bb_caseD_ffb4:
      this->_is_keyPAD4 = is_pressed;
      switch(keycode) {
      case 0xffb5:
        goto switchD_0018e3bb_caseD_ffb5;
      case 0xffb6:
        goto switchD_0018e3bb_caseD_ffb6;
      case 0xffb7:
        goto switchD_0018e3bb_caseD_ffb7;
      case 0xffb8:
        goto switchD_0018e3bb_caseD_ffb8;
      case 0xffb9:
        goto switchD_0018e3bb_caseD_ffb9;
      default:
        goto switchD_001903b2_default;
      }
    case 0xffb5:
switchD_0018e3bb_caseD_ffb5:
      this->_is_keyPAD5 = is_pressed;
      switch(keycode) {
      case 0xffb6:
        goto switchD_0018e3bb_caseD_ffb6;
      case 0xffb7:
        goto switchD_0018e3bb_caseD_ffb7;
      case 0xffb8:
        goto switchD_0018e3bb_caseD_ffb8;
      case 0xffb9:
        goto switchD_0018e3bb_caseD_ffb9;
      }
      goto switchD_001903b2_default;
    case 0xffb6:
switchD_0018e3bb_caseD_ffb6:
      this->_is_keyPAD6 = is_pressed;
      if (0xffb7 < (int)keycode) {
        if (keycode == 0xffb8) goto switchD_0018e3bb_caseD_ffb8;
        if (keycode != 0xffb9) goto LAB_00190489;
        goto switchD_0018e3bb_caseD_ffb9;
      }
      if (keycode == 0xffab) goto switchD_0018e3bb_caseD_ffab;
      if (keycode == 0xffb7) goto switchD_0018e3bb_caseD_ffb7;
LAB_00190489:
      if (keycode == 0xffaa) {
switchD_0018e3bb_caseD_ffaa:
        this->_is_keyPADMUL = is_pressed;
        if (keycode == 0xffaf) {
switchD_0018e3bb_caseD_ffaf:
          this->_is_keyPADDIV = is_pressed;
        }
      }
      else {
        if (keycode == 0xffaf) goto switchD_0018e3bb_caseD_ffaf;
        if (keycode == 0xffad) {
switchD_0018e3bb_caseD_ffad:
          this->_is_keyPADSUB = is_pressed;
LAB_001904aa:
          if (keycode == 0xffaf) goto switchD_0018e3bb_caseD_ffaf;
          if (keycode == 0xffaa) goto switchD_0018e3bb_caseD_ffaa;
        }
      }
      break;
    case 0xffb7:
switchD_0018e3bb_caseD_ffb7:
      this->_is_keyPAD7 = is_pressed;
      if (0xffb7 < (int)keycode) {
        if (keycode != 0xffb9) {
          if (keycode != 0xffb8) goto LAB_001904aa;
          goto switchD_0018e3bb_caseD_ffb8;
        }
        goto switchD_0018e3bb_caseD_ffb9;
      }
      if (keycode == 0xffab) goto switchD_0018e3bb_caseD_ffab;
      if (keycode == 0xffad) goto switchD_0018e3bb_caseD_ffad;
      goto LAB_001904aa;
    case 0xffb8:
switchD_0018e3bb_caseD_ffb8:
      this->_is_keyPAD8 = is_pressed;
switchD_0018f564_caseD_ff55:
      if (keycode - 0xffaa < 6) {
        pCVar2 = (CImgDisplay *)
                 (*(code *)(&DAT_00250f88 + *(int *)(&DAT_00250f88 + (ulong)(keycode - 0xffaa) * 4))
                 )();
        return pCVar2;
      }
      if (keycode == 0xffb9) goto switchD_0018e3bb_caseD_ffb9;
      break;
    case 0xffb9:
switchD_0018e3bb_caseD_ffb9:
      this->_is_keyPAD9 = is_pressed;
switchD_001903b2_default:
      if (keycode - 0xffaa < 6) {
        pCVar2 = (CImgDisplay *)
                 (*(code *)(&DAT_00250fa0 + *(int *)(&DAT_00250fa0 + (ulong)(keycode - 0xffaa) * 4))
                 )();
        return pCVar2;
      }
    }
    break;
  case 0xffea:
switchD_0018e3bb_caseD_ffea:
    this->_is_keyALTGR = is_pressed;
switchD_0018ff16_caseD_ffe4:
    if ((int)keycode < 0xffaa) goto LAB_00190127;
    switch(keycode) {
    case 0xffaa:
      goto switchD_0018e3bb_caseD_ffaa;
    case 0xffab:
      goto switchD_0018e3bb_caseD_ffab;
    case 0xffac:
    case 0xffae:
      break;
    case 0xffad:
      goto switchD_0018e3bb_caseD_ffad;
    case 0xffaf:
      goto switchD_0018e3bb_caseD_ffaf;
    case 0xffb0:
      goto switchD_0018e3bb_caseD_ffb0;
    case 0xffb1:
      goto switchD_0018e3bb_caseD_ffb1;
    case 0xffb2:
      goto switchD_0018e3bb_caseD_ffb2;
    case 0xffb3:
      goto switchD_0018e3bb_caseD_ffb3;
    case 0xffb4:
      goto switchD_0018e3bb_caseD_ffb4;
    case 0xffb5:
      goto switchD_0018e3bb_caseD_ffb5;
    case 0xffb6:
      goto switchD_0018e3bb_caseD_ffb6;
    case 0xffb7:
      goto switchD_0018e3bb_caseD_ffb7;
    case 0xffb8:
      goto switchD_0018e3bb_caseD_ffb8;
    case 0xffb9:
      goto switchD_0018e3bb_caseD_ffb9;
    default:
      if (keycode == 0xffe4) goto switchD_0018e3bb_caseD_ffe4;
      if (keycode == 0xffec) goto switchD_0018e3bb_caseD_ffec;
    }
    break;
  case 0xffeb:
switchD_0018e3bb_caseD_ffeb:
    this->_is_keyAPPLEFT = is_pressed;
switchD_0018e9e0_caseD_1:
    if (0xff66 < (int)keycode) {
      switch(keycode) {
      case 0xffaa:
        goto switchD_0018e3bb_caseD_ffaa;
      case 0xffab:
        goto switchD_0018e3bb_caseD_ffab;
      case 0xffac:
      case 0xffae:
        goto switchD_0018e3bb_caseD_ffac;
      case 0xffad:
        goto switchD_0018e3bb_caseD_ffad;
      case 0xffaf:
        goto switchD_0018e3bb_caseD_ffaf;
      case 0xffb0:
        goto switchD_0018e3bb_caseD_ffb0;
      case 0xffb1:
        goto switchD_0018e3bb_caseD_ffb1;
      case 0xffb2:
        goto switchD_0018e3bb_caseD_ffb2;
      case 0xffb3:
        goto switchD_0018e3bb_caseD_ffb3;
      case 0xffb4:
        goto switchD_0018e3bb_caseD_ffb4;
      case 0xffb5:
        goto switchD_0018e3bb_caseD_ffb5;
      case 0xffb6:
        goto switchD_0018e3bb_caseD_ffb6;
      case 0xffb7:
        goto switchD_0018e3bb_caseD_ffb7;
      case 0xffb8:
        goto switchD_0018e3bb_caseD_ffb8;
      case 0xffb9:
        goto switchD_0018e3bb_caseD_ffb9;
      default:
        switch(keycode) {
        case 0xffe4:
          goto switchD_0018e3bb_caseD_ffe4;
        case 0xffe5:
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
        case 0xffeb:
          goto switchD_0018e3bb_caseD_ffac;
        case 0xffe9:
          goto switchD_0018e3bb_caseD_ffe9;
        case 0xffea:
          goto switchD_0018e3bb_caseD_ffea;
        case 0xffec:
          goto switchD_0018e3bb_caseD_ffec;
        default:
          goto switchD_0018ffe4_default;
        }
      }
    }
LAB_0018ff8e:
    if ((int)keycode < 0xff53) {
      if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
      if (keycode == 0xff51) goto switchD_0018e45a_caseD_1;
      break;
    }
    goto switchD_00190263_default;
  case 0xffec:
switchD_0018e3bb_caseD_ffec:
    this->_is_keyAPPRIGHT = is_pressed;
switchD_0018f263_caseD_65:
    if ((int)keycode < 0xff67) goto LAB_00190221;
    switch(keycode) {
    case 0xffaa:
      goto switchD_0018e3bb_caseD_ffaa;
    case 0xffab:
      goto switchD_0018e3bb_caseD_ffab;
    case 0xffac:
    case 0xffae:
      goto switchD_0018e3bb_caseD_ffac;
    case 0xffad:
      goto switchD_0018e3bb_caseD_ffad;
    case 0xffaf:
      goto switchD_0018e3bb_caseD_ffaf;
    case 0xffb0:
      goto switchD_0018e3bb_caseD_ffb0;
    case 0xffb1:
      goto switchD_0018e3bb_caseD_ffb1;
    case 0xffb2:
      goto switchD_0018e3bb_caseD_ffb2;
    case 0xffb3:
      goto switchD_0018e3bb_caseD_ffb3;
    case 0xffb4:
      goto switchD_0018e3bb_caseD_ffb4;
    case 0xffb5:
      goto switchD_0018e3bb_caseD_ffb5;
    case 0xffb6:
      goto switchD_0018e3bb_caseD_ffb6;
    case 0xffb7:
      goto switchD_0018e3bb_caseD_ffb7;
    case 0xffb8:
      goto switchD_0018e3bb_caseD_ffb8;
    case 0xffb9:
      goto switchD_0018e3bb_caseD_ffb9;
    default:
      if (keycode == 0xffe4) goto switchD_0018e3bb_caseD_ffe4;
    }
switchD_0018ffe4_default:
    if (keycode != 0xff67) break;
switchD_0018e45a_caseD_17:
    this->_is_keyMENU = is_pressed;
    if (0xff53 < (int)keycode) {
      if (keycode == 0xff54) goto switchD_0018e45a_caseD_4;
      if (keycode != 0xffb0) {
        if (keycode == 0xffe4) goto switchD_0018e3bb_caseD_ffe4;
        goto LAB_001902d6;
      }
      goto switchD_0018e3bb_caseD_ffb0;
    }
    if (keycode == 0xff51) goto switchD_0018e45a_caseD_1;
    if (keycode == 0xff53) goto switchD_0018e45a_caseD_3;
    goto LAB_001902d6;
  default:
    goto switchD_0018ffe4_default;
  }
switchD_0018e3bb_caseD_ffac:
  puVar4 = this->_keys;
  if (is_pressed) {
    if (*puVar4 != 0) {
      memmove(puVar4 + 1,puVar4,0x1fc);
    }
    *this->_keys = keycode;
    puVar4 = this->_released_keys;
    if (*puVar4 == 0) goto LAB_00190549;
    uVar3 = 0;
LAB_00190534:
    memmove(puVar4 + 1,puVar4,0x1fc);
  }
  else {
    if (*puVar4 != 0) {
      memmove(puVar4 + 1,puVar4,0x1fc);
      *this->_keys = 0;
    }
    puVar4 = this->_released_keys;
    uVar3 = keycode;
    if (*puVar4 != 0) goto LAB_00190534;
  }
  *this->_released_keys = uVar3;
LAB_00190549:
  this->_is_event = keycode != 0;
  if (keycode != 0) {
    if ((cimg::X11_attr()::val == '\0') &&
       (iVar1 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar1 != 0)) {
      cimg::X11_static::X11_static(&cimg::X11_attr::val);
      __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
      __cxa_guard_release(&cimg::X11_attr()::val);
    }
    pthread_cond_broadcast((pthread_cond_t *)&cimg::X11_attr::val.wait_event);
  }
  return this;
switchD_0018e4a9_caseD_75:
  this->_is_keyU = is_pressed;
  if (0xff55 < (int)keycode) {
    if (keycode != 0xff56) {
      if (keycode != 0xff57) goto LAB_0018f177;
      goto switchD_0018e45a_caseD_7;
    }
    goto switchD_0018e45a_caseD_6;
  }
  if (keycode == 0x69) goto switchD_0018e4a9_caseD_69;
  if (keycode == 0x6f) goto switchD_0018e4a9_caseD_6f;
  if (keycode != 0x70) goto switchD_0018eb86_caseD_66;
switchD_0018e4a9_caseD_70:
  this->_is_keyP = is_pressed;
switchD_0018f031_caseD_6a:
  if ((int)keycode < 0xff0d) {
    switch(keycode) {
    case 0x61:
switchD_0018e4a9_caseD_61:
      this->_is_keyA = is_pressed;
switchD_0018e8a4_caseD_62:
      if ((int)keycode < 0xff51) {
        switch(keycode) {
        case 0x62:
          goto switchD_0018e4a9_caseD_62;
        case 99:
          goto switchD_0018e4a9_caseD_63;
        case 100:
          goto switchD_0018e4a9_caseD_64;
        case 0x65:
        case 0x69:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x75:
        case 0x77:
        case 0x79:
          break;
        case 0x66:
          goto switchD_0018e4a9_caseD_66;
        case 0x67:
          goto switchD_0018e4a9_caseD_67;
        case 0x68:
          goto switchD_0018e4a9_caseD_68;
        case 0x6a:
          goto switchD_0018e4a9_caseD_6a;
        case 0x6b:
          goto switchD_0018e4a9_caseD_6b;
        case 0x6c:
          goto switchD_0018e4a9_caseD_6c;
        case 0x6d:
          goto switchD_0018e4a9_caseD_6d;
        case 0x6e:
          goto switchD_0018e4a9_caseD_6e;
        case 0x73:
          goto switchD_0018e4a9_caseD_73;
        case 0x76:
          goto switchD_0018e4a9_caseD_76;
        case 0x78:
          goto switchD_0018e4a9_caseD_78;
        case 0x7a:
          goto switchD_0018e4a9_caseD_7a;
        default:
          if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
          if (keycode == 0xff0d) goto LAB_0018faf4;
        }
        goto switchD_0018f5ff_caseD_65;
      }
      if (0xffb0 < (int)keycode) {
        switch(keycode) {
        case 0xffe1:
          goto switchD_0018e3bb_caseD_ffe1;
        case 0xffe2:
          goto switchD_0018e3bb_caseD_ffe2;
        case 0xffe3:
          goto switchD_0018e3bb_caseD_ffe3;
        case 0xffe4:
          goto switchD_0018e3bb_caseD_ffe4;
        case 0xffe5:
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          goto switchD_0018f5ff_caseD_65;
        case 0xffe9:
          goto switchD_0018e3bb_caseD_ffe9;
        case 0xffea:
          goto switchD_0018e3bb_caseD_ffea;
        case 0xffeb:
          goto switchD_0018e3bb_caseD_ffeb;
        case 0xffec:
          goto switchD_0018e3bb_caseD_ffec;
        default:
          if (keycode != 0xffb1) goto switchD_0018f5ff_caseD_65;
          goto switchD_0018e3bb_caseD_ffb1;
        }
      }
      switch(keycode) {
      case 0xff51:
        goto switchD_0018e45a_caseD_1;
      case 0xff52:
        goto switchD_0018e45a_caseD_2;
      case 0xff53:
        goto switchD_0018e45a_caseD_3;
      case 0xff54:
        goto switchD_0018e45a_caseD_4;
      default:
        if (keycode == 0xff67) goto switchD_0018e45a_caseD_17;
        if (keycode != 0xffb0) goto switchD_0018f5ff_caseD_65;
        goto switchD_0018e3bb_caseD_ffb0;
      }
    case 0x62:
      goto switchD_0018e4a9_caseD_62;
    case 99:
      goto switchD_0018e4a9_caseD_63;
    case 100:
switchD_0018e4a9_caseD_64:
      this->_is_keyD = is_pressed;
      switch(keycode) {
      case 0x66:
        goto switchD_0018e4a9_caseD_66;
      case 0x67:
        goto switchD_0018e4a9_caseD_67;
      case 0x68:
        goto switchD_0018e4a9_caseD_68;
      case 0x69:
        goto switchD_0018f6b8_caseD_69;
      case 0x6a:
        goto switchD_0018e4a9_caseD_6a;
      case 0x6b:
        goto switchD_0018e4a9_caseD_6b;
      case 0x6c:
        goto switchD_0018e4a9_caseD_6c;
      default:
        if (keycode != 0xff0d) goto switchD_0018f6b8_caseD_69;
        goto LAB_0018faf4;
      }
    case 0x65:
    case 0x69:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x74:
    case 0x75:
    case 0x77:
    case 0x79:
      goto switchD_0018e52b_caseD_ffe6;
    case 0x66:
switchD_0018e4a9_caseD_66:
      this->_is_keyF = is_pressed;
switchD_0018ec1d_caseD_62:
      if (0xff66 < (int)keycode) {
        switch(keycode) {
        case 0xffaa:
          goto switchD_0018e3bb_caseD_ffaa;
        case 0xffab:
          goto switchD_0018e3bb_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0018e3bb_caseD_ffac;
        case 0xffad:
          goto switchD_0018e3bb_caseD_ffad;
        case 0xffaf:
          goto switchD_0018e3bb_caseD_ffaf;
        case 0xffb0:
          goto switchD_0018e3bb_caseD_ffb0;
        case 0xffb1:
          goto switchD_0018e3bb_caseD_ffb1;
        case 0xffb2:
          goto switchD_0018e3bb_caseD_ffb2;
        case 0xffb3:
          goto switchD_0018e3bb_caseD_ffb3;
        case 0xffb4:
          goto switchD_0018e3bb_caseD_ffb4;
        case 0xffb5:
          goto switchD_0018e3bb_caseD_ffb5;
        case 0xffb6:
          goto switchD_0018e3bb_caseD_ffb6;
        case 0xffb7:
          goto switchD_0018e3bb_caseD_ffb7;
        case 0xffb8:
          goto switchD_0018e3bb_caseD_ffb8;
        case 0xffb9:
          goto switchD_0018e3bb_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe1:
            goto switchD_0018e3bb_caseD_ffe1;
          case 0xffe2:
            goto switchD_0018e3bb_caseD_ffe2;
          case 0xffe3:
            goto switchD_0018e3bb_caseD_ffe3;
          case 0xffe4:
            goto switchD_0018e3bb_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
            goto switchD_0018e3bb_caseD_ffac;
          case 0xffe9:
            goto switchD_0018e3bb_caseD_ffe9;
          case 0xffea:
            goto switchD_0018e3bb_caseD_ffea;
          case 0xffeb:
            goto switchD_0018e3bb_caseD_ffeb;
          case 0xffec:
            goto switchD_0018e3bb_caseD_ffec;
          }
        }
        goto switchD_0018ffe4_default;
      }
      if (0xff0c < (int)keycode) {
        switch(keycode) {
        case 0xff51:
          goto switchD_0018e45a_caseD_1;
        case 0xff52:
          goto switchD_0018e45a_caseD_2;
        case 0xff53:
          goto switchD_0018e45a_caseD_3;
        case 0xff54:
          goto switchD_0018e45a_caseD_4;
        }
        goto switchD_0018fae5_default;
      }
      switch(keycode) {
      case 0x62:
        goto switchD_0018e4a9_caseD_62;
      case 99:
        goto switchD_0018e4a9_caseD_63;
      case 100:
      case 0x65:
      case 0x66:
      case 0x69:
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x72:
      case 0x73:
      case 0x74:
      case 0x75:
      case 0x77:
      case 0x79:
        goto switchD_0018e3bb_caseD_ffac;
      case 0x67:
        goto switchD_0018e4a9_caseD_67;
      case 0x68:
        goto switchD_0018e4a9_caseD_68;
      case 0x6a:
        goto switchD_0018e4a9_caseD_6a;
      case 0x6b:
        goto switchD_0018e4a9_caseD_6b;
      case 0x6c:
        goto switchD_0018e4a9_caseD_6c;
      case 0x6d:
        goto switchD_0018e4a9_caseD_6d;
      case 0x6e:
        goto switchD_0018e4a9_caseD_6e;
      case 0x76:
        goto switchD_0018e4a9_caseD_76;
      case 0x78:
        goto switchD_0018e4a9_caseD_78;
      case 0x7a:
        goto switchD_0018e4a9_caseD_7a;
      }
      goto switchD_0018f7c3_default;
    case 0x67:
switchD_0018e4a9_caseD_67:
      this->_is_keyG = is_pressed;
      break;
    case 0x68:
switchD_0018e4a9_caseD_68:
      this->_is_keyH = is_pressed;
switchD_0018edb6_caseD_62:
      if (0xff66 < (int)keycode) {
        switch(keycode) {
        case 0xffaa:
          goto switchD_0018e3bb_caseD_ffaa;
        case 0xffab:
          goto switchD_0018e3bb_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0018e3bb_caseD_ffac;
        case 0xffad:
          goto switchD_0018e3bb_caseD_ffad;
        case 0xffaf:
          goto switchD_0018e3bb_caseD_ffaf;
        case 0xffb0:
          goto switchD_0018e3bb_caseD_ffb0;
        case 0xffb1:
          goto switchD_0018e3bb_caseD_ffb1;
        case 0xffb2:
          goto switchD_0018e3bb_caseD_ffb2;
        case 0xffb3:
          goto switchD_0018e3bb_caseD_ffb3;
        case 0xffb4:
          goto switchD_0018e3bb_caseD_ffb4;
        case 0xffb5:
          goto switchD_0018e3bb_caseD_ffb5;
        case 0xffb6:
          goto switchD_0018e3bb_caseD_ffb6;
        case 0xffb7:
          goto switchD_0018e3bb_caseD_ffb7;
        case 0xffb8:
          goto switchD_0018e3bb_caseD_ffb8;
        case 0xffb9:
          goto switchD_0018e3bb_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe1:
            goto switchD_0018e3bb_caseD_ffe1;
          case 0xffe2:
            goto switchD_0018e3bb_caseD_ffe2;
          case 0xffe3:
            goto switchD_0018e3bb_caseD_ffe3;
          case 0xffe4:
            goto switchD_0018e3bb_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
            goto switchD_0018e3bb_caseD_ffac;
          case 0xffe9:
            goto switchD_0018e3bb_caseD_ffe9;
          case 0xffea:
            goto switchD_0018e3bb_caseD_ffea;
          case 0xffeb:
            goto switchD_0018e3bb_caseD_ffeb;
          case 0xffec:
            goto switchD_0018e3bb_caseD_ffec;
          default:
            goto switchD_0018ffe4_default;
          }
        }
      }
      if ((int)keycode < 0xff0d) {
        switch(keycode) {
        case 0x62:
          goto switchD_0018e4a9_caseD_62;
        case 99:
          goto switchD_0018e4a9_caseD_63;
        case 100:
        case 0x65:
        case 0x66:
        case 0x67:
        case 0x68:
        case 0x69:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x73:
        case 0x74:
        case 0x75:
        case 0x77:
        case 0x79:
          goto switchD_0018e3bb_caseD_ffac;
        case 0x6a:
          goto switchD_0018e4a9_caseD_6a;
        case 0x6b:
          goto switchD_0018e4a9_caseD_6b;
        case 0x6c:
          goto switchD_0018e4a9_caseD_6c;
        case 0x6d:
          goto switchD_0018e4a9_caseD_6d;
        case 0x6e:
          goto switchD_0018e4a9_caseD_6e;
        case 0x76:
          goto switchD_0018e4a9_caseD_76;
        case 0x78:
          goto switchD_0018e4a9_caseD_78;
        case 0x7a:
          goto switchD_0018e4a9_caseD_7a;
        default:
          goto switchD_0018f7c3_default;
        }
      }
      switch(keycode) {
      case 0xff51:
        goto switchD_0018e45a_caseD_1;
      case 0xff52:
        goto switchD_0018e45a_caseD_2;
      case 0xff53:
        goto switchD_0018e45a_caseD_3;
      case 0xff54:
        goto switchD_0018e45a_caseD_4;
      }
      goto switchD_0018fae5_default;
    case 0x6a:
switchD_0018e4a9_caseD_6a:
      this->_is_keyJ = is_pressed;
switchD_0018f5d3_caseD_62:
      if (0xff66 < (int)keycode) {
        switch(keycode) {
        case 0xffaa:
          goto switchD_0018e3bb_caseD_ffaa;
        case 0xffab:
          goto switchD_0018e3bb_caseD_ffab;
        case 0xffac:
        case 0xffae:
          goto switchD_0018e3bb_caseD_ffac;
        case 0xffad:
          goto switchD_0018e3bb_caseD_ffad;
        case 0xffaf:
          goto switchD_0018e3bb_caseD_ffaf;
        case 0xffb0:
          goto switchD_0018e3bb_caseD_ffb0;
        case 0xffb1:
          goto switchD_0018e3bb_caseD_ffb1;
        case 0xffb2:
          goto switchD_0018e3bb_caseD_ffb2;
        case 0xffb3:
          goto switchD_0018e3bb_caseD_ffb3;
        case 0xffb4:
          goto switchD_0018e3bb_caseD_ffb4;
        case 0xffb5:
          goto switchD_0018e3bb_caseD_ffb5;
        case 0xffb6:
          goto switchD_0018e3bb_caseD_ffb6;
        case 0xffb7:
          goto switchD_0018e3bb_caseD_ffb7;
        case 0xffb8:
          goto switchD_0018e3bb_caseD_ffb8;
        case 0xffb9:
          goto switchD_0018e3bb_caseD_ffb9;
        default:
          switch(keycode) {
          case 0xffe1:
            goto switchD_0018e3bb_caseD_ffe1;
          case 0xffe2:
            goto switchD_0018e3bb_caseD_ffe2;
          case 0xffe3:
            goto switchD_0018e3bb_caseD_ffe3;
          case 0xffe4:
            goto switchD_0018e3bb_caseD_ffe4;
          case 0xffe5:
          case 0xffe6:
          case 0xffe7:
          case 0xffe8:
            goto switchD_0018e3bb_caseD_ffac;
          case 0xffe9:
            goto switchD_0018e3bb_caseD_ffe9;
          case 0xffea:
            goto switchD_0018e3bb_caseD_ffea;
          case 0xffeb:
            goto switchD_0018e3bb_caseD_ffeb;
          case 0xffec:
            goto switchD_0018e3bb_caseD_ffec;
          default:
            goto switchD_0018ffe4_default;
          }
        }
      }
      if (0x6a < (int)keycode) {
        switch(keycode) {
        case 0x6b:
          goto switchD_0018e4a9_caseD_6b;
        case 0x6c:
          goto switchD_0018e4a9_caseD_6c;
        case 0x6d:
          goto switchD_0018e4a9_caseD_6d;
        case 0x6e:
          goto switchD_0018e4a9_caseD_6e;
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x73:
        case 0x74:
        case 0x75:
        case 0x77:
        case 0x79:
          goto switchD_0018e3bb_caseD_ffac;
        case 0x76:
          goto switchD_0018e4a9_caseD_76;
        case 0x78:
          goto switchD_0018e4a9_caseD_78;
        case 0x7a:
          goto switchD_0018e4a9_caseD_7a;
        default:
          switch(keycode) {
          case 0xff51:
            goto switchD_0018e45a_caseD_1;
          case 0xff52:
            goto switchD_0018e45a_caseD_2;
          case 0xff53:
            goto switchD_0018e45a_caseD_3;
          case 0xff54:
            goto switchD_0018e45a_caseD_4;
          }
          goto switchD_0018fae5_default;
        }
      }
      goto LAB_0018fb2b;
    case 0x6b:
switchD_0018e4a9_caseD_6b:
      this->_is_keyK = is_pressed;
      if ((int)keycode < 0x7a) {
        if (keycode != 99) {
          if (keycode == 0x6c) goto switchD_0018e4a9_caseD_6c;
          if (keycode != 0x78) goto LAB_0018fc3b;
          goto switchD_0018e4a9_caseD_78;
        }
        goto switchD_0018e4a9_caseD_63;
      }
      if (keycode == 0x7a) goto switchD_0018e4a9_caseD_7a;
      if (keycode == 0xff0d) goto LAB_0018faf4;
      if (keycode == 0xffe1) goto switchD_0018e3bb_caseD_ffe1;
      goto LAB_0018fc3b;
    case 0x6c:
switchD_0018e4a9_caseD_6c:
      this->_is_keyL = is_pressed;
switchD_0018f695_caseD_65:
      if ((int)keycode < 0xff67) {
        if (0x79 < (int)keycode) {
          if (keycode - 0xff51 < 4) {
            pCVar2 = (CImgDisplay *)
                     (*(code *)(&DAT_002508f8 +
                               *(int *)(&DAT_002508f8 + (ulong)(keycode - 0xff51) * 4)))();
            return pCVar2;
          }
          if (keycode != 0x7a) goto switchD_0018fae5_default;
          goto switchD_0018e4a9_caseD_7a;
        }
        if ((int)keycode < 0x6d) goto LAB_0018fb2b;
        if (0x75 < (int)keycode) {
          if (keycode != 0x76) {
            if (keycode != 0x78) goto switchD_0018e3bb_caseD_ffac;
            goto switchD_0018e4a9_caseD_78;
          }
          goto switchD_0018e4a9_caseD_76;
        }
        if (keycode == 0x6d) goto switchD_0018e4a9_caseD_6d;
        goto switchD_0018fda3_default;
      }
      if (keycode - 0xffaa < 0x10) {
        pCVar2 = (CImgDisplay *)
                 (*(code *)(&DAT_00250908 + *(int *)(&DAT_00250908 + (ulong)(keycode - 0xffaa) * 4))
                 )();
        return pCVar2;
      }
      if (keycode - 0xffe1 < 0xc) {
        pCVar2 = (CImgDisplay *)
                 (*(code *)(&DAT_00250948 + *(int *)(&DAT_00250948 + (ulong)(keycode - 0xffe1) * 4))
                 )();
        return pCVar2;
      }
      goto switchD_0018ffe4_default;
    case 0x6d:
      goto switchD_0018e4a9_caseD_6d;
    case 0x6e:
      goto switchD_0018e4a9_caseD_6e;
    case 0x73:
switchD_0018e4a9_caseD_73:
      this->_is_keyS = is_pressed;
      switch(keycode) {
      case 100:
        goto switchD_0018e4a9_caseD_64;
      default:
        goto switchD_0018f695_caseD_65;
      case 0x66:
        goto switchD_0018e4a9_caseD_66;
      case 0x67:
        goto switchD_0018e4a9_caseD_67;
      case 0x68:
        goto switchD_0018e4a9_caseD_68;
      case 0x6a:
        goto switchD_0018e4a9_caseD_6a;
      case 0x6b:
        goto switchD_0018e4a9_caseD_6b;
      case 0x6c:
        goto switchD_0018e4a9_caseD_6c;
      }
    case 0x76:
      goto switchD_0018e4a9_caseD_76;
    case 0x78:
      goto switchD_0018e4a9_caseD_78;
    case 0x7a:
      goto switchD_0018e4a9_caseD_7a;
    default:
switchD_0018e4a9_default:
      if (keycode != 0x20) goto switchD_0018e52b_caseD_ffe6;
      goto switchD_0018e41b_caseD_20;
    }
    goto LAB_0018f719;
  }
  if (0xff66 < (int)keycode) {
    switch(keycode) {
    case 0xffe1:
      goto switchD_0018e3bb_caseD_ffe1;
    case 0xffe2:
      goto switchD_0018e3bb_caseD_ffe2;
    case 0xffe3:
      goto switchD_0018e3bb_caseD_ffe3;
    case 0xffe4:
      goto switchD_0018e3bb_caseD_ffe4;
    case 0xffe5:
switchD_0018e3bb_caseD_ffe5:
      this->_is_keyCAPSLOCK = is_pressed;
      switch(keycode) {
      case 0x61:
        goto switchD_0018e4a9_caseD_61;
      case 0x62:
      case 99:
      case 0x65:
      case 0x69:
        break;
      case 100:
        goto switchD_0018e4a9_caseD_64;
      case 0x66:
        goto switchD_0018e4a9_caseD_66;
      case 0x67:
        goto switchD_0018e4a9_caseD_67;
      case 0x68:
        goto switchD_0018e4a9_caseD_68;
      case 0x6a:
        goto switchD_0018e4a9_caseD_6a;
      default:
        if (keycode == 0x73) goto switchD_0018e4a9_caseD_73;
      }
      goto switchD_0018f5d3_caseD_62;
    case 0xffe6:
    case 0xffe7:
    case 0xffe8:
      goto switchD_0018e52b_caseD_ffe6;
    case 0xffe9:
      goto switchD_0018e3bb_caseD_ffe9;
    case 0xffea:
      goto switchD_0018e3bb_caseD_ffea;
    case 0xffeb:
      goto switchD_0018e3bb_caseD_ffeb;
    case 0xffec:
      goto switchD_0018e3bb_caseD_ffec;
    default:
switchD_0018e52b_default:
      if (keycode == 0xff67) goto switchD_0018e45a_caseD_17;
      if (keycode != 0xffff) goto switchD_0018e52b_caseD_ffe6;
switchD_0018e3bb_caseD_ffff:
      this->_is_keyDELETE = is_pressed;
switchD_0018f0ad_caseD_6a:
      if ((int)keycode < 0xff51) {
        switch(keycode) {
        case 0x61:
          goto switchD_0018e4a9_caseD_61;
        case 0x62:
          goto switchD_0018e4a9_caseD_62;
        case 99:
          goto switchD_0018e4a9_caseD_63;
        case 100:
          goto switchD_0018e4a9_caseD_64;
        case 0x65:
        case 0x69:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x74:
        case 0x75:
        case 0x77:
        case 0x79:
          break;
        case 0x66:
          goto switchD_0018e4a9_caseD_66;
        case 0x67:
          goto switchD_0018e4a9_caseD_67;
        case 0x68:
          goto switchD_0018e4a9_caseD_68;
        case 0x6a:
          goto switchD_0018e4a9_caseD_6a;
        case 0x6b:
          goto switchD_0018e4a9_caseD_6b;
        case 0x6c:
          goto switchD_0018e4a9_caseD_6c;
        case 0x6d:
          goto switchD_0018e4a9_caseD_6d;
        case 0x6e:
          goto switchD_0018e4a9_caseD_6e;
        case 0x73:
          goto switchD_0018e4a9_caseD_73;
        case 0x76:
          goto switchD_0018e4a9_caseD_76;
        case 0x78:
          goto switchD_0018e4a9_caseD_78;
        case 0x7a:
          goto switchD_0018e4a9_caseD_7a;
        default:
          if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
          if (keycode == 0xff0d) goto LAB_0018faf4;
        }
      }
      else {
        switch(keycode) {
        case 0xffe1:
          goto switchD_0018e3bb_caseD_ffe1;
        case 0xffe2:
          goto switchD_0018e3bb_caseD_ffe2;
        case 0xffe3:
          goto switchD_0018e3bb_caseD_ffe3;
        case 0xffe4:
          goto switchD_0018e3bb_caseD_ffe4;
        case 0xffe5:
          goto switchD_0018e3bb_caseD_ffe5;
        case 0xffe6:
        case 0xffe7:
        case 0xffe8:
          break;
        case 0xffe9:
          goto switchD_0018e3bb_caseD_ffe9;
        case 0xffea:
          goto switchD_0018e3bb_caseD_ffea;
        case 0xffeb:
          goto switchD_0018e3bb_caseD_ffeb;
        case 0xffec:
          goto switchD_0018e3bb_caseD_ffec;
        default:
          switch(keycode) {
          case 0xff51:
            goto switchD_0018e45a_caseD_1;
          case 0xff52:
            goto switchD_0018e45a_caseD_2;
          case 0xff53:
          case 0xff54:
          case 0xff55:
            break;
          case 0xff56:
            goto switchD_0018e45a_caseD_6;
          case 0xff57:
            goto switchD_0018e45a_caseD_7;
          default:
            if (keycode == 0xff67) goto switchD_0018e45a_caseD_17;
          }
        }
      }
    }
    goto switchD_0018f497_caseD_65;
  }
LAB_0018f340:
  if ((int)keycode < 0xff56) {
    if (keycode == 0xff0d) goto LAB_0018faf4;
    if (keycode != 0xff52) goto switchD_0018e52b_caseD_ffe6;
    goto switchD_0018e45a_caseD_2;
  }
  if (keycode == 0xff56) {
switchD_0018e45a_caseD_6:
    this->_is_keyPAGEDOWN = is_pressed;
switchD_0018eb86_caseD_66:
    if ((int)keycode < 0xff51) {
      if (keycode - 0x61 < 0x1a) {
        pCVar2 = (CImgDisplay *)
                 (*(code *)(&DAT_002503d8 + *(int *)(&DAT_002503d8 + (ulong)(keycode - 0x61) * 4)))
                           ();
        return pCVar2;
      }
      if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
      if (keycode == 0xff0d) goto LAB_0018faf4;
    }
    else {
      if (keycode - 0xffe1 < 0xc) {
        pCVar2 = (CImgDisplay *)
                 (*(code *)(&DAT_00250450 + *(int *)(&DAT_00250450 + (ulong)(keycode - 0xffe1) * 4))
                 )();
        return pCVar2;
      }
      switch(keycode) {
      case 0xff51:
        goto switchD_0018e45a_caseD_1;
      case 0xff52:
        goto switchD_0018e45a_caseD_2;
      case 0xff53:
        goto switchD_0018e45a_caseD_3;
      case 0xff54:
        goto switchD_0018e45a_caseD_4;
      default:
        if (keycode == 0xff67) goto switchD_0018e45a_caseD_17;
      }
    }
    goto LAB_001902b0;
  }
  if (keycode != 0xff57) goto switchD_0018e52b_caseD_ffe6;
switchD_0018e45a_caseD_7:
  this->_is_keyEND = is_pressed;
LAB_0018f4db:
  if ((int)keycode < 0xff67) {
    if ((int)keycode < 0xff0d) {
      if (keycode - 0x61 < 0x1a) {
        pCVar2 = (CImgDisplay *)
                 (*(code *)(&DAT_00250304 + *(int *)(&DAT_00250304 + (ulong)(keycode - 0x61) * 4)))
                           ();
        return pCVar2;
      }
      if (keycode == 0x20) goto switchD_0018e41b_caseD_20;
    }
    else {
      switch(keycode) {
      case 0xff51:
        goto switchD_0018e45a_caseD_1;
      case 0xff52:
        goto switchD_0018e45a_caseD_2;
      case 0xff53:
        goto switchD_0018e45a_caseD_3;
      case 0xff54:
        goto switchD_0018e45a_caseD_4;
      case 0xff55:
        break;
      case 0xff56:
        goto switchD_0018e45a_caseD_6;
      default:
        if (keycode == 0xff0d) goto LAB_0018faf4;
      }
    }
  }
  else {
    if (keycode - 0xffb0 < 9) {
      pCVar2 = (CImgDisplay *)
               (*(code *)(&DAT_00250384 + *(int *)(&DAT_00250384 + (ulong)(keycode - 0xffb0) * 4)))
                         ();
      return pCVar2;
    }
    if (keycode - 0xffe1 < 0xc) {
      pCVar2 = (CImgDisplay *)
               (*(code *)(&DAT_002503a8 + *(int *)(&DAT_002503a8 + (ulong)(keycode - 0xffe1) * 4)))
                         ();
      return pCVar2;
    }
    if (keycode == 0xff67) goto switchD_0018e45a_caseD_17;
  }
  goto switchD_0018f564_caseD_ff55;
}

Assistant:

CImgDisplay& set_key(const unsigned int keycode, const bool is_pressed=true) {
#define _cimg_set_key(k) if (keycode==cimg::key##k) _is_key##k = is_pressed;
      _cimg_set_key(ESC); _cimg_set_key(F1); _cimg_set_key(F2); _cimg_set_key(F3);
      _cimg_set_key(F4); _cimg_set_key(F5); _cimg_set_key(F6); _cimg_set_key(F7);
      _cimg_set_key(F8); _cimg_set_key(F9); _cimg_set_key(F10); _cimg_set_key(F11);
      _cimg_set_key(F12); _cimg_set_key(PAUSE); _cimg_set_key(1); _cimg_set_key(2);
      _cimg_set_key(3); _cimg_set_key(4); _cimg_set_key(5); _cimg_set_key(6);
      _cimg_set_key(7); _cimg_set_key(8); _cimg_set_key(9); _cimg_set_key(0);
      _cimg_set_key(BACKSPACE); _cimg_set_key(INSERT); _cimg_set_key(HOME);
      _cimg_set_key(PAGEUP); _cimg_set_key(TAB); _cimg_set_key(Q); _cimg_set_key(W);
      _cimg_set_key(E); _cimg_set_key(R); _cimg_set_key(T); _cimg_set_key(Y);
      _cimg_set_key(U); _cimg_set_key(I); _cimg_set_key(O); _cimg_set_key(P);
      _cimg_set_key(DELETE); _cimg_set_key(END); _cimg_set_key(PAGEDOWN);
      _cimg_set_key(CAPSLOCK); _cimg_set_key(A); _cimg_set_key(S); _cimg_set_key(D);
      _cimg_set_key(F); _cimg_set_key(G); _cimg_set_key(H); _cimg_set_key(J);
      _cimg_set_key(K); _cimg_set_key(L); _cimg_set_key(ENTER);
      _cimg_set_key(SHIFTLEFT); _cimg_set_key(Z); _cimg_set_key(X); _cimg_set_key(C);
      _cimg_set_key(V); _cimg_set_key(B); _cimg_set_key(N); _cimg_set_key(M);
      _cimg_set_key(SHIFTRIGHT); _cimg_set_key(ARROWUP); _cimg_set_key(CTRLLEFT);
      _cimg_set_key(APPLEFT); _cimg_set_key(ALT); _cimg_set_key(SPACE); _cimg_set_key(ALTGR);
      _cimg_set_key(APPRIGHT); _cimg_set_key(MENU); _cimg_set_key(CTRLRIGHT);
      _cimg_set_key(ARROWLEFT); _cimg_set_key(ARROWDOWN); _cimg_set_key(ARROWRIGHT);
      _cimg_set_key(PAD0); _cimg_set_key(PAD1); _cimg_set_key(PAD2);
      _cimg_set_key(PAD3); _cimg_set_key(PAD4); _cimg_set_key(PAD5);
      _cimg_set_key(PAD6); _cimg_set_key(PAD7); _cimg_set_key(PAD8);
      _cimg_set_key(PAD9); _cimg_set_key(PADADD); _cimg_set_key(PADSUB);
      _cimg_set_key(PADMUL); _cimg_set_key(PADDIV);
      if (is_pressed) {
        if (*_keys)
          std::memmove((void*)(_keys + 1),(void*)_keys,127*sizeof(unsigned int));
        *_keys = keycode;
        if (*_released_keys) {
          std::memmove((void*)(_released_keys + 1),(void*)_released_keys,127*sizeof(unsigned int));
          *_released_keys = 0;
        }
      } else {
        if (*_keys) {
          std::memmove((void*)(_keys + 1),(void*)_keys,127*sizeof(unsigned int));
          *_keys = 0;
        }
        if (*_released_keys)
          std::memmove((void*)(_released_keys + 1),(void*)_released_keys,127*sizeof(unsigned int));
        *_released_keys = keycode;
      }
      _is_event = keycode?true:false;
      if (keycode) {
#if cimg_display==1
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
#elif cimg_display==2
        SetEvent(cimg::Win32_attr().wait_event);
#endif
      }
      return *this;
    }